

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O3

TestCaseGroup * vkt::pipeline::createSpecConstantTests(TestContext *testCtx)

{
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *this;
  VkShaderStageFlagBits stage;
  undefined1 auVar1 [8];
  undefined8 uVar2;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *this_00;
  bool bVar3;
  DataType specConstId;
  DataType DVar4;
  DataType DVar5;
  TestNode *pTVar6;
  SpecConstantTest *pSVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  long *plVar11;
  pointer __dest;
  pointer *__dest_00;
  int iVar12;
  CaseDefinition *pCVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  DataType type;
  uint uVar15;
  long lVar16;
  OffsetValue *o4;
  bool bVar17;
  string globalDecl;
  string accumTypeStr;
  string mainCode_1;
  string caseName;
  string ssboDecl;
  CaseDefinition defs [5];
  ostringstream mainCode;
  StageDef stages [6];
  undefined1 local_1088 [8];
  TestContext *local_1080;
  VkShaderStageFlagBits local_1074;
  undefined1 local_1070 [8];
  _Alloc_hider local_1068;
  pointer local_1060;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1058;
  deUint32 local_1048;
  GenericValue local_1040;
  pointer **local_1038;
  pointer *local_1030;
  pointer *local_1028 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1018;
  undefined1 local_1010 [8];
  _Alloc_hider local_1008;
  undefined1 local_1000 [24];
  deUint32 local_fe8;
  GenericValue local_fe0;
  undefined1 *local_fd8;
  OffsetValue local_fd0;
  pointer local_fc0 [2];
  OffsetValue local_fb0;
  pointer local_fa0 [2];
  undefined1 local_f90 [8];
  _Alloc_hider local_f88;
  size_type local_f80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f78;
  deUint32 local_f68;
  GenericValue local_f60;
  OffsetValue local_f58;
  pointer local_f48 [2];
  OffsetValue local_f38;
  pointer local_f28 [2];
  OffsetValue local_f18;
  pointer local_f08 [2];
  undefined1 local_ef8 [8];
  _Alloc_hider local_ef0;
  undefined1 local_ee8 [24];
  deUint32 local_ed0;
  GenericValue local_ec8;
  undefined1 local_ec0 [8];
  _Alloc_hider local_eb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_eb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ea8;
  deUint32 local_e98;
  GenericValue local_e90;
  undefined1 local_e88 [8];
  _Alloc_hider local_e80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e70;
  deUint32 local_e60;
  GenericValue local_e58;
  undefined1 local_e50 [8];
  _Alloc_hider local_e48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e38;
  deUint32 local_e28;
  GenericValue local_e20;
  undefined1 local_e18 [8];
  _Alloc_hider local_e10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e00;
  deUint32 local_df0;
  GenericValue local_de8;
  ulong *local_de0;
  ulong local_dd8;
  ulong local_dd0 [2];
  undefined1 local_dc0 [8];
  _Alloc_hider local_db8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_db0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_da8;
  deUint32 local_d98;
  GenericValue local_d90;
  OffsetValue local_d88;
  pointer local_d78 [2];
  undefined1 local_d68 [8];
  _Alloc_hider local_d60;
  undefined1 local_d58 [24];
  deUint32 local_d40;
  GenericValue local_d38;
  undefined1 local_d30 [8];
  _Alloc_hider local_d28;
  pointer local_d20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d18;
  deUint32 local_d08;
  GenericValue local_d00;
  OffsetValue local_cf8;
  pointer local_ce8 [2];
  undefined1 *local_cd8;
  undefined1 *local_cd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_cc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_cc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_cb8;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_cb0;
  pointer local_ca8;
  ulong *local_ca0;
  ulong local_c98;
  ulong local_c90 [2];
  ulong *local_c80;
  ulong local_c78;
  ulong local_c70 [2];
  TestNode *local_c60;
  undefined1 *local_c58;
  pointer **local_c50;
  undefined1 *local_c48;
  ulong *local_c40;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_c38;
  pointer *local_c30;
  undefined1 *local_c28;
  ulong *local_c20;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_c18;
  ulong *local_c10;
  pointer *local_c08;
  undefined1 *local_c00;
  pointer *local_bf8;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_bf0;
  pointer *local_be8;
  long *local_be0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_bd8;
  string *local_bd0;
  OffsetValue local_bc8;
  undefined1 *local_bb8;
  OffsetValue local_bb0;
  pointer *local_ba0 [2];
  OffsetValue local_b90;
  ulong local_b80 [2];
  ulong **local_b70;
  ulong **local_b68;
  TestNode *local_b60;
  TestNode *local_b58;
  OffsetValue local_b50;
  undefined1 local_b40 [8];
  _Alloc_hider local_b38;
  char local_b30 [8];
  undefined1 local_b28 [16];
  deUint32 local_b18;
  GenericValue local_b10;
  VkDeviceSize local_b08;
  _Alloc_hider local_b00;
  size_type local_af8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_af0 [3];
  undefined1 auStack_ac0 [32];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  vStack_aa0;
  FeatureFlags local_a88;
  pointer **local_a80;
  ulong **local_a78;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_a70;
  string *local_a68;
  string *local_a60;
  undefined1 local_a58 [64];
  _Alloc_hider local_a18;
  pointer local_a10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a08;
  _Alloc_hider local_9f8;
  pointer local_9f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e8;
  _Alloc_hider local_9d8;
  pointer local_9d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9c8;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_9b8;
  FeatureFlags local_9a0;
  undefined1 local_998 [64];
  _Alloc_hider local_958;
  pointer local_950;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_948;
  _Alloc_hider local_938;
  size_type local_930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_928;
  _Alloc_hider local_918;
  pointer local_910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_908;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_8f8;
  FeatureFlags local_8e0;
  long *local_8d8;
  long local_8d0;
  long local_8c8 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_8b8;
  undefined8 local_8a0;
  pointer *local_898;
  pointer local_890;
  pointer local_888;
  undefined1 local_87b;
  undefined1 *local_878;
  undefined8 local_870;
  undefined1 local_868 [16];
  pointer *local_858;
  pointer local_850;
  pointer local_848 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_838;
  undefined4 local_820;
  pointer *local_818;
  pointer local_810;
  pointer local_808 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_7f8;
  undefined8 local_7e0;
  ulong *local_7d8;
  ulong local_7d0;
  ulong local_7c8;
  undefined1 local_7ba;
  undefined1 *local_7b8;
  undefined8 local_7b0;
  undefined1 local_7a8 [16];
  pointer *local_798;
  pointer local_790;
  pointer local_788 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_778;
  undefined4 local_760;
  ulong *local_758;
  ulong local_750;
  ulong local_748 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_738;
  undefined8 local_720;
  ulong *local_718;
  pointer *local_710;
  pointer *local_708;
  undefined1 local_6f9;
  undefined1 *local_6f8;
  undefined8 local_6f0;
  undefined1 local_6e8 [16];
  pointer **local_6d8;
  pointer *local_6d0;
  pointer *local_6c8 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_6b8;
  undefined4 local_6a0;
  ulong *local_698;
  ulong local_690;
  ulong local_688 [2];
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_678;
  undefined8 local_660;
  long *local_658;
  long local_650;
  long local_648 [2];
  long *local_638;
  long local_630;
  long local_628 [2];
  long *local_618;
  long local_610;
  long local_608 [2];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_5f8;
  undefined4 local_5e0;
  undefined2 *local_5d8;
  undefined8 local_5d0;
  undefined2 local_5c8;
  undefined1 local_5c6;
  undefined1 local_5c5;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  local_5b8;
  undefined8 local_5a0;
  undefined1 *local_598 [2];
  undefined1 local_588 [16];
  undefined1 *local_578 [2];
  undefined1 local_568 [16];
  undefined1 *local_558 [2];
  undefined1 local_548 [16];
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  local_538;
  undefined4 local_520;
  TestNode *local_518;
  long *local_510;
  long *local_508;
  long *local_500;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *local_4f8;
  ulong *local_4f0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_4e8;
  string *local_4e0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_4d8;
  string *local_4d0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_4c8;
  string *local_4c0;
  OffsetValue local_4b8;
  deUint64 local_4a8 [2];
  OffsetValue local_498;
  OffsetValue local_488;
  value_type local_478;
  value_type local_468;
  value_type local_458;
  OffsetValue local_448;
  OffsetValue local_438;
  OffsetValue local_428;
  pointer **local_418;
  long **local_410;
  string *local_408;
  string *local_400;
  string *local_3f8;
  TestNode **local_3f0;
  long local_3e8;
  ulong **local_3e0;
  pointer **local_3d8;
  ulong **local_3d0;
  long **local_3c8;
  pointer **local_3c0;
  long **local_3b8;
  long **local_3b0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_3a8;
  string *local_3a0;
  string *local_398;
  string *local_390;
  SpecConstantTest *local_388;
  OffsetValue local_380;
  OffsetValue local_370;
  OffsetValue local_360;
  undefined1 local_350 [8];
  _Alloc_hider local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  deUint32 local_328;
  GenericValue local_320;
  ios_base local_2e0 [264];
  ulong **local_1d8;
  long local_1d0;
  vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
  *local_1c8;
  undefined1 *local_1c0;
  OffsetValue local_1b8;
  OffsetValue local_1a8;
  OffsetValue local_198;
  OffsetValue local_188;
  OffsetValue local_178;
  OffsetValue local_168;
  OffsetValue local_158;
  OffsetValue local_148;
  OffsetValue local_138;
  OffsetValue local_128;
  OffsetValue local_118;
  OffsetValue local_108;
  OffsetValue local_f8;
  OffsetValue local_e8;
  OffsetValue local_d8;
  TestNode *local_c8;
  char *local_c0;
  VkShaderStageFlagBits local_b8 [2];
  TestNode *local_b0;
  char *local_a8;
  undefined4 local_a0;
  TestNode *local_98;
  char *local_90;
  undefined4 local_88;
  TestNode *local_80;
  char *local_78;
  undefined4 local_70;
  TestNode *local_68;
  char *local_60;
  undefined4 local_58;
  TestNode *local_50;
  char *local_48;
  undefined4 local_40;
  
  local_518 = (TestNode *)operator_new(0x70);
  local_1080 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_518,testCtx,"spec_constant","Specialization constants tests");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,local_1080,"graphics","");
  local_c0 = "vertex";
  local_b8[0] = VK_SHADER_STAGE_VERTEX_BIT;
  local_a8 = "fragment";
  local_a0 = 0x10;
  local_90 = "tess_control";
  local_88 = 2;
  local_78 = "tess_eval";
  local_70 = 4;
  local_60 = "geometry";
  local_58 = 8;
  local_50 = local_518;
  local_48 = "compute";
  local_40 = 0x20;
  local_c8 = pTVar6;
  local_b0 = pTVar6;
  local_98 = pTVar6;
  local_80 = pTVar6;
  local_68 = pTVar6;
  tcu::TestNode::addChild(local_518,pTVar6);
  local_bd0 = (string *)&local_9d8;
  local_1018 = &local_9c8;
  local_bd8 = &local_9b8;
  local_cd8 = local_998;
  local_ca8 = local_998 + 0x10;
  local_3c8 = &local_8d8;
  local_fd8 = local_998;
  local_3b8 = &local_8d8;
  local_cd0 = local_998;
  local_1c0 = auStack_ac0;
  local_1c8 = &vStack_aa0;
  local_c58 = local_998;
  local_410 = &local_8d8;
  local_3b0 = &local_8d8;
  local_a80 = &local_818;
  local_3d8 = &local_818;
  local_418 = &local_818;
  local_3c0 = &local_818;
  local_b70 = &local_758;
  local_1d8 = &local_758;
  local_b68 = &local_758;
  local_3d0 = &local_758;
  local_a78 = &local_698;
  local_3e0 = &local_698;
  local_bb8 = local_998;
  local_cb0 = (vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
               *)(local_998 + 0x20);
  local_a60 = (string *)&local_958;
  local_cb8 = &local_948;
  local_cc0 = &local_928;
  local_a68 = (string *)&local_918;
  local_cc8 = &local_908;
  local_a70 = &local_8f8;
  local_be0 = local_8c8;
  local_bf0 = &local_8b8;
  local_bf8 = &local_888;
  local_c00 = local_868;
  local_4c0 = (string *)&local_858;
  local_c08 = local_848;
  local_4c8 = &local_838;
  local_be8 = local_808;
  local_c18 = &local_7f8;
  local_c20 = &local_7c8;
  local_c28 = local_7a8;
  local_4d0 = (string *)&local_798;
  local_c30 = local_788;
  local_4d8 = &local_778;
  local_c10 = local_748;
  local_c38 = &local_738;
  local_c40 = (ulong *)&local_708;
  local_c48 = local_6e8;
  local_4e0 = (string *)&local_6d8;
  local_c50 = local_6c8;
  local_4e8 = &local_6b8;
  local_3f8 = (string *)&local_898;
  local_400 = (string *)&local_7d8;
  local_408 = (string *)&local_718;
  local_4f0 = local_688;
  local_4f8 = &local_678;
  local_390 = (string *)&local_658;
  local_500 = local_648;
  local_398 = (string *)&local_638;
  local_508 = local_628;
  local_3a0 = (string *)&local_618;
  local_510 = local_608;
  local_3a8 = &local_5f8;
  lVar16 = 0;
  do {
    local_c60 = (TestNode *)operator_new(0x70);
    local_1d0 = lVar16;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_c60,local_1080,*(char **)(local_b8 + lVar16 * 6 + -2),"");
    local_3f0 = &local_c8 + lVar16 * 3;
    stage = local_b8[lVar16 * 6];
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_1080,"default_value","use default constant value");
    local_a58._0_8_ = local_a58 + 0x10;
    local_a58._8_8_ = 4;
    local_a58._16_5_ = 0x6c6f6f62;
    local_dc0 = (undefined1  [8])&local_db0;
    local_b40 = (undefined1  [8])0x32;
    local_dc0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_dc0,(ulong)local_b40);
    local_db0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b40;
    *(undefined8 *)((long)local_dc0 + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)((long)local_dc0 + 0x28) = 0x757274203d203063;
    *(undefined8 *)((long)local_dc0 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_dc0 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_dc0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_dc0 + 4),"ut(c",4);
    *(undefined4 *)((long)local_dc0 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_dc0 + 0xc),"ant_",4);
    *(undefined2 *)((long)local_dc0 + 0x30) = 0x3b65;
    local_db8._M_p = (pointer)local_b40;
    *(char *)((long)local_dc0 + (long)local_b40) = '\0';
    local_350._0_4_ = 1;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_dc0,(char *)((long)local_b40 + (long)local_dc0));
    local_328 = 0;
    local_320.m_data = 0;
    local_e18 = (undefined1  [8])&local_e08;
    local_1070 = (undefined1  [8])&DAT_00000033;
    local_e18 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_e18,(ulong)local_1070);
    local_e08 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1070;
    *(undefined8 *)((long)local_e18 + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)((long)local_e18 + 0x28) = 0x6c6166203d203163;
    *(undefined8 *)((long)local_e18 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_e18 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_e18 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_e18 + 4),"ut(c",4);
    *(undefined4 *)((long)local_e18 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_e18 + 0xc),"ant_",4);
    builtin_strncpy((char *)((long)local_e18 + 0x2f),"lse;",4);
    local_e10._M_p = (pointer)local_1070;
    *(char *)((long)local_e18 + (long)local_1070) = '\0';
    local_b40._0_4_ = 2;
    local_b38._M_p = local_b28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b38,local_e18,(char *)((long)local_1070 + (long)local_e18));
    local_b18 = 0;
    local_b10.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_a58 + 0x20),(SpecConstant *)local_350,(SpecConstant *)local_b40);
    local_a58._56_8_ = 8;
    local_a18._M_p = (pointer)&local_a08;
    local_1070 = (undefined1  [8])0x1a;
    local_a18._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_a18,(ulong)local_1070)
    ;
    local_a08._M_allocated_capacity._0_5_ = local_1070._0_5_;
    local_a08._M_allocated_capacity._5_3_ = local_1070._5_3_;
    builtin_strncpy(local_a18._M_p,"    bool r0;\n    bool r1;\n",0x1a);
    local_a10 = (pointer)local_1070;
    local_a18._M_p[(long)local_1070] = '\0';
    local_9f8._M_p = (pointer)&local_9e8;
    local_9f0 = (pointer)0x0;
    local_9e8._M_allocated_capacity = local_9e8._M_allocated_capacity & 0xffffffffffffff00;
    local_9d8._M_p = (pointer)local_1018;
    local_1070 = (undefined1  [8])0x2a;
    local_9d8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_bd0,(ulong)local_1070);
    local_9c8._M_allocated_capacity = (size_type)local_1070;
    builtin_strncpy(local_9d8._M_p,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_9d0 = (pointer)local_1070;
    local_9d8._M_p[(long)local_1070] = '\0';
    local_fd0.size = 4;
    local_fd0.offset = 0;
    local_fd0.value.m_data = 1;
    local_d88.size = 4;
    local_d88.offset = 4;
    local_d88.value.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_bd8,&local_fd0,&local_d88);
    local_9a0 = 0;
    local_998._0_8_ = local_ca8;
    local_ca8[2] = 't';
    local_ca8[0] = 'i';
    local_ca8[1] = 'n';
    local_998._8_8_ = 3;
    local_998[0x13] = '\0';
    local_e50 = (undefined1  [8])&local_e40;
    local_1010 = (undefined1  [8])0x2f;
    local_e50 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_e50,(ulong)local_1010);
    local_e40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1010;
    builtin_strncpy((char *)((long)local_e50 + 0x1f),"st int s",8);
    builtin_strncpy((char *)((long)local_e50 + 0x27),"c0 = -3;",8);
    *(undefined8 *)((long)local_e50 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_e50 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_e50 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_e50 + 4),"ut(c",4);
    *(undefined4 *)((long)local_e50 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_e50 + 0xc),"ant_",4);
    local_e48._M_p = (pointer)local_1010;
    *(char *)((long)local_e50 + (long)local_1010) = '\0';
    local_1070._0_4_ = 1;
    local_1068._M_p = (pointer)&local_1058;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1068,local_e50,(char *)((long)local_1010 + (long)local_e50));
    local_1048 = 0;
    local_1040.m_data = 0;
    local_e88 = (undefined1  [8])&local_e78;
    local_f90 = (undefined1  [8])0x2f;
    local_e88 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_e88,(ulong)local_f90);
    local_e78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f90;
    builtin_strncpy((char *)((long)local_e88 + 0x1f),"st int s",8);
    builtin_strncpy((char *)((long)local_e88 + 0x27),"c1 = 17;",8);
    *(undefined8 *)((long)local_e88 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_e88 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_e88 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_e88 + 4),"ut(c",4);
    *(undefined4 *)((long)local_e88 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_e88 + 0xc),"ant_",4);
    local_e80._M_p = (pointer)local_f90;
    *(char *)((long)local_e88 + (long)local_f90) = '\0';
    local_1010._0_4_ = 2;
    local_1008._M_p = local_1000 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1008,local_e88,(char *)((long)local_f90 + (long)local_e88));
    local_fe8 = 0;
    local_fe0.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_cb0,(SpecConstant *)local_1070,(SpecConstant *)local_1010);
    local_998._56_8_ = 8;
    local_958._M_p = (pointer)local_cb8;
    local_f90 = (undefined1  [8])0x18;
    local_958._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_a60,(ulong)local_f90);
    local_948._M_allocated_capacity = (size_type)local_f90;
    builtin_strncpy(local_958._M_p,"    int r0;\n    int r1;\n",0x18);
    local_950 = (pointer)local_f90;
    local_958._M_p[(long)local_f90] = '\0';
    local_938._M_p = (pointer)local_cc0;
    local_930 = 0;
    local_928._M_local_buf[0] = '\0';
    local_918._M_p = (pointer)local_cc8;
    local_f90 = (undefined1  [8])0x2a;
    local_918._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_a68,(ulong)local_f90);
    local_908._M_allocated_capacity = (size_type)local_f90;
    builtin_strncpy(local_918._M_p,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_910 = (pointer)local_f90;
    local_918._M_p[(long)local_f90] = '\0';
    local_f18.size = 4;
    local_f18.offset = 0;
    local_f18.value.m_data = 0xfffffffd;
    local_f38.size = 4;
    local_f38.offset = 4;
    local_f38.value.m_data = 0x11;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_a70,&local_f18,&local_f38);
    local_8e0 = 0;
    local_8d8 = local_be0;
    local_8d0 = 4;
    local_8c8[0] = CONCAT35(local_8c8[0]._5_3_,0x746e6975);
    local_ec0 = (undefined1  [8])&local_eb0;
    local_ef8 = (undefined1  [8])0x31;
    local_ec0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_ec0,(ulong)local_ef8);
    local_eb0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ef8;
    *(undefined8 *)((long)local_ec0 + 0x20) = 0x7320746e69752074;
    *(undefined8 *)((long)local_ec0 + 0x28) = 0x753234203d203063;
    *(undefined8 *)((long)local_ec0 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_ec0 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_ec0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_ec0 + 4),"ut(c",4);
    *(undefined4 *)((long)local_ec0 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_ec0 + 0xc),"ant_",4);
    *(char *)((long)local_ec0 + 0x30) = ';';
    local_eb8._M_p = (pointer)local_ef8;
    *(char *)((long)local_ec0 + (long)local_ef8) = '\0';
    local_f90._0_4_ = 1;
    local_f88._M_p = (pointer)&local_f78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f88,local_ec0,(char *)((long)local_ef8 + (long)local_ec0));
    local_f68 = 0;
    local_f60.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_bf0,(SpecConstant *)local_f90);
    local_8a0 = 4;
    local_898 = local_bf8;
    builtin_strncpy((char *)((long)local_bf8 + 5),"int r0;\n",8);
    *local_bf8 = (pointer)0x746e697520202020;
    local_890 = (pointer)0xd;
    local_87b = 0;
    local_878 = local_c00;
    local_870 = 0;
    local_868[0] = 0;
    local_858 = local_c08;
    local_ef8 = (undefined1  [8])0x15;
    local_858 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4c0,(ulong)local_ef8);
    local_848[0] = (pointer)local_ef8;
    builtin_strncpy((char *)local_858,"    sb_out.r0 = sc0;\n",0x15);
    local_850 = (pointer)local_ef8;
    *(char *)((long)local_858 + (long)local_ef8) = '\0';
    local_f58.size = 4;
    local_f58.offset = 0;
    local_f58.value.m_data = 0x2a;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4c8,&local_f58);
    local_820 = 0;
    local_818 = local_be8;
    *(char *)((long)local_be8 + 4) = 't';
    *(undefined4 *)local_be8 = 0x616f6c66;
    local_810 = (pointer)0x5;
    local_808[0]._0_6_ = (uint6)(uint5)local_808[0];
    local_d30 = (undefined1  [8])&local_d20;
    local_d68 = (undefined1  [8])0x32;
    local_d30 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_d30,(ulong)local_d68);
    local_d20 = (pointer)local_d68;
    *(undefined8 *)((long)local_d30 + 0x20) = 0x2074616f6c662074;
    *(undefined8 *)((long)local_d30 + 0x28) = 0x2e37203d20306373;
    *(undefined8 *)((long)local_d30 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_d30 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_d30 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_d30 + 4),"ut(c",4);
    *(undefined4 *)((long)local_d30 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_d30 + 0xc),"ant_",4);
    *(undefined2 *)((long)local_d30 + 0x30) = 0x3b35;
    local_d28._M_p = (pointer)local_d68;
    *(char *)((long)local_d30 + (long)local_d68) = '\0';
    local_ef8._0_4_ = 1;
    local_ef0._M_p = local_ee8 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ef0,local_d30,(pointer)((long)local_d68 + (long)local_d30));
    local_ed0 = 0;
    local_ec8.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_c18,(SpecConstant *)local_ef8);
    local_7e0 = 4;
    local_7d8 = local_c20;
    builtin_strncpy((char *)((long)local_c20 + 6),"oat r0;\n",8);
    *local_c20 = 0x616f6c6620202020;
    local_7d0 = 0xe;
    local_7ba = 0;
    local_7b8 = local_c28;
    local_7b0 = 0;
    local_7a8[0] = 0;
    local_798 = local_c30;
    local_d68 = (undefined1  [8])0x15;
    local_798 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4d0,(ulong)local_d68);
    local_788[0] = (pointer)local_d68;
    builtin_strncpy((char *)local_798,"    sb_out.r0 = sc0;\n",0x15);
    local_790 = (pointer)local_d68;
    *(char *)((long)local_798 + (long)local_d68) = '\0';
    local_cf8.size = 4;
    local_cf8.offset = 0;
    local_cf8.value.m_data = 0x40f00000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4d8,&local_cf8);
    local_760 = 0;
    local_758 = local_c10;
    ((char *)((long)local_c10 + 4))[0] = 'l';
    ((char *)((long)local_c10 + 4))[1] = 'e';
    *(undefined4 *)local_c10 = 0x62756f64;
    local_750 = 6;
    local_748[0]._0_7_ = (uint7)(uint6)local_748[0];
    local_1038 = local_1028;
    local_fb0._0_8_ = (pointer *)0x36;
    local_1038 = (pointer **)std::__cxx11::string::_M_create((ulong *)&local_1038,(ulong)&local_fb0)
    ;
    local_1028[0] = (pointer *)local_fb0._0_8_;
    local_1038[4] = (pointer *)0x656c62756f642074;
    local_1038[5] = (pointer *)0x32203d2030637320;
    local_1038[2] = (pointer *)0x497b24203d206469;
    local_1038[3] = (pointer *)0x736e6f6320297d44;
    *(undefined4 *)local_1038 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_1038 + 4),"ut(c",4);
    *(undefined4 *)(local_1038 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_1038 + 0xc),"ant_",4);
    builtin_strncpy((char *)((long)local_1038 + 0x2e)," 2.75LF;",8);
    local_1030 = (pointer *)local_fb0._0_8_;
    *(char *)((long)local_1038 + local_fb0._0_8_) = '\0';
    local_d68._0_4_ = 1;
    local_d60._M_p = local_d58 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d60,local_1038,(char *)((long)local_1038 + local_fb0._0_8_));
    local_d40 = 0;
    local_d38.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_c38,(SpecConstant *)local_d68);
    local_720 = 8;
    local_718 = local_c40;
    builtin_strncpy((char *)((long)local_c40 + 7),"ble r0;\n",8);
    *local_c40 = 0x62756f6420202020;
    local_710 = (pointer *)0xf;
    local_6f9 = 0;
    local_6f8 = local_c48;
    local_6f0 = 0;
    local_6e8[0] = 0;
    local_6d8 = local_c50;
    local_fb0._0_8_ = (pointer *)0x15;
    local_6d8 = (pointer **)std::__cxx11::string::_M_create((ulong *)local_4e0,(ulong)&local_fb0);
    local_6c8[0] = (pointer *)local_fb0._0_8_;
    builtin_strncpy((char *)local_6d8,"    sb_out.r0 = sc0;\n",0x15);
    local_6d0 = (pointer *)local_fb0._0_8_;
    *(char *)((long)local_6d8 + local_fb0._0_8_) = '\0';
    local_fb0.size = 8;
    local_fb0.offset = 0;
    local_fb0.value.m_data = 0x4006000000000000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4e8,&local_fb0);
    local_6a0 = 4;
    if (local_d60._M_p != local_d58 + 8) {
      operator_delete(local_d60._M_p,local_d58._8_8_ + 1);
    }
    if (local_1038 != local_1028) {
      operator_delete(local_1038,(long)local_1028[0] + 1);
    }
    if (local_ef0._M_p != local_ee8 + 8) {
      operator_delete(local_ef0._M_p,local_ee8._8_8_ + 1);
    }
    if (local_d30 != (undefined1  [8])&local_d20) {
      operator_delete((void *)local_d30,(ulong)(local_d20 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f88._M_p != &local_f78) {
      operator_delete(local_f88._M_p,local_f78._M_allocated_capacity + 1);
    }
    if (local_ec0 != (undefined1  [8])&local_eb0) {
      operator_delete((void *)local_ec0,(ulong)(local_eb0->_M_local_buf + 1));
    }
    if (local_1008._M_p != local_1000 + 8) {
      operator_delete(local_1008._M_p,local_1000._8_8_ + 1);
    }
    if (local_e88 != (undefined1  [8])&local_e78) {
      operator_delete((void *)local_e88,(ulong)(local_e78->_M_local_buf + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1068._M_p != &local_1058) {
      operator_delete(local_1068._M_p,local_1058._M_allocated_capacity + 1);
    }
    if (local_e50 != (undefined1  [8])&local_e40) {
      operator_delete((void *)local_e50,(ulong)(local_e40->_M_local_buf + 1));
    }
    if (local_b38._M_p != local_b28) {
      operator_delete(local_b38._M_p,local_b28._0_8_ + 1);
    }
    if (local_e18 != (undefined1  [8])&local_e08) {
      operator_delete((void *)local_e18,(ulong)(local_e08->_M_local_buf + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    if (local_dc0 != (undefined1  [8])&local_db0) {
      operator_delete((void *)local_dc0,(ulong)(local_db0->_M_local_buf + 1));
    }
    lVar16 = 0;
    do {
      pSVar7 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar7,local_1080,stage,(CaseDefinition *)(local_a58 + lVar16));
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      lVar16 = lVar16 + 0xc0;
    } while (lVar16 != 0x3c0);
    lVar16 = 0x300;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_a58 + lVar16));
      lVar16 = lVar16 + -0xc0;
    } while (lVar16 != -0xc0);
    tcu::TestNode::addChild(local_c60,pTVar6);
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_1080,"basic","specialize a constant");
    local_a58._0_8_ = local_a58 + 0x10;
    local_a58._8_8_ = 4;
    local_a58._16_5_ = 0x6c6f6f62;
    local_1038 = local_1028;
    local_b40 = (undefined1  [8])0x32;
    local_1038 = (pointer **)std::__cxx11::string::_M_create((ulong *)&local_1038,(ulong)local_b40);
    local_1028[0] = (pointer *)local_b40;
    local_1038[4] = (pointer *)0x73206c6f6f622074;
    local_1038[5] = (pointer *)0x757274203d203063;
    local_1038[2] = (pointer *)0x497b24203d206469;
    local_1038[3] = (pointer *)0x736e6f6320297d44;
    *(undefined4 *)local_1038 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_1038 + 4),"ut(c",4);
    *(undefined4 *)(local_1038 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_1038 + 0xc),"ant_",4);
    *(undefined2 *)(local_1038 + 6) = 0x3b65;
    local_1030 = (pointer *)local_b40;
    *(char *)((long)local_1038 + (long)local_b40) = '\0';
    local_350._0_4_ = 1;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_1038,(pointer)((long)local_b40 + (long)local_1038));
    local_328 = 4;
    local_320.m_data = 1;
    local_fd0._0_8_ = local_fc0;
    local_1070 = (undefined1  [8])0x33;
    local_fd0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_fd0,(ulong)local_1070);
    local_fc0[0] = (pointer)local_1070;
    *(undefined8 *)(local_fd0._0_8_ + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)(local_fd0._0_8_ + 0x28) = 0x6c6166203d203163;
    *(undefined8 *)(local_fd0._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_fd0._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_fd0._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_fd0._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_fd0._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_fd0._0_8_ + 0xc),"ant_",4);
    builtin_strncpy((char *)(local_fd0._0_8_ + 0x2f),"lse;",4);
    local_fd0.value.m_data = (deUint64)local_1070;
    *(char *)(local_fd0._0_8_ + (long)local_1070) = '\0';
    local_b40._0_4_ = 2;
    local_b38._M_p = local_b28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b38,local_fd0._0_8_,(char *)(local_fd0._0_8_ + (long)local_1070));
    local_b18 = 4;
    local_b10.m_data = 0;
    local_d88._0_8_ = local_d78;
    local_1010 = (undefined1  [8])0x32;
    local_d88._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_d88,(ulong)local_1010);
    local_d78[0] = (pointer)local_1010;
    *(undefined8 *)(local_d88._0_8_ + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)(local_d88._0_8_ + 0x28) = 0x757274203d203263;
    *(undefined8 *)(local_d88._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_d88._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_d88._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_d88._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_d88._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_d88._0_8_ + 0xc),"ant_",4);
    *(undefined2 *)(local_d88._0_8_ + 0x30) = 0x3b65;
    local_d88.value.m_data = (deUint64)local_1010;
    *(char *)(local_d88._0_8_ + (long)local_1010) = '\0';
    local_1070._0_4_ = 3;
    local_1068._M_p = (pointer)&local_1058;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1068,local_d88._0_8_,(pointer)((long)local_1010 + local_d88._0_8_));
    local_1048 = 4;
    local_1040.m_data = 0;
    local_f18._0_8_ = local_f08;
    local_f90 = (undefined1  [8])0x33;
    local_f18._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f18,(ulong)local_f90);
    local_f08[0] = (pointer)local_f90;
    *(undefined8 *)(local_f18._0_8_ + 0x20) = 0x73206c6f6f622074;
    *(undefined8 *)(local_f18._0_8_ + 0x28) = 0x6c6166203d203363;
    *(undefined8 *)(local_f18._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_f18._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_f18._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_f18._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_f18._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_f18._0_8_ + 0xc),"ant_",4);
    builtin_strncpy((char *)(local_f18._0_8_ + 0x2f),"lse;",4);
    local_f18.value.m_data = (deUint64)local_f90;
    *(char *)(local_f18._0_8_ + (long)local_f90) = '\0';
    local_1010._0_4_ = 4;
    local_1008._M_p = local_1000 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1008,local_f18._0_8_,(char *)(local_f18._0_8_ + (long)local_f90));
    local_fe8 = 4;
    local_fe0.m_data = 1;
    this = (vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
            *)(local_a58 + 0x20);
    local_a58._32_8_ = (pointer)0x0;
    local_a58._40_8_ = (pointer)0x0;
    local_a58._48_8_ = (pointer)0x0;
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::reserve(this,4);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_350);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_b40);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_1070);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
    ::push_back(this,(value_type *)local_1010);
    local_a58._56_8_ = 0x10;
    local_a18._M_p = (pointer)&local_a08;
    local_f90 = (undefined1  [8])0x34;
    local_a18._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_a18,(ulong)local_f90);
    local_a08._M_allocated_capacity._0_5_ = local_f90._0_5_;
    local_a08._M_allocated_capacity._5_3_ = local_f90._5_3_;
    builtin_strncpy(local_a18._M_p,"    bool r0;\n    bool r1;\n    bool r2;\n    bool r3;\n",0x34);
    local_a10 = (pointer)local_f90;
    local_a18._M_p[(long)local_f90] = '\0';
    local_9f8._M_p = (pointer)&local_9e8;
    local_9f0 = (pointer)0x0;
    local_9e8._M_allocated_capacity = local_9e8._M_allocated_capacity & 0xffffffffffffff00;
    local_9d8._M_p = (pointer)local_1018;
    local_f90 = (undefined1  [8])0x54;
    local_9d8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_bd0,(ulong)local_f90);
    auVar1 = local_f90;
    local_9c8._M_allocated_capacity = (size_type)local_f90;
    memcpy(local_9d8._M_p,
           "    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n    sb_out.r2 = sc2;\n    sb_out.r3 = sc3;\n"
           ,0x54);
    local_9d0 = (pointer)auVar1;
    local_9d8._M_p[(long)auVar1] = '\0';
    local_4b8.size = 4;
    local_4b8.offset = 0;
    local_4b8.value.m_data = 1;
    local_428.size = 4;
    local_428.offset = 4;
    local_428.value.m_data = 0;
    local_438.size = 4;
    local_438.offset = 8;
    local_438.value.m_data = 0;
    local_448.size = 4;
    local_448.offset = 0xc;
    local_448.value.m_data = 1;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_bd8,&local_4b8,&local_428,&local_438,&local_448);
    local_9a0 = 0;
    local_998._0_8_ = local_ca8;
    local_ca8[2] = 't';
    local_ca8[0] = 'i';
    local_ca8[1] = 'n';
    local_998._8_8_ = 3;
    local_998[0x13] = '\0';
    local_f38._0_8_ = local_f28;
    local_ef8 = (undefined1  [8])0x2f;
    local_f38._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f38,(ulong)local_ef8);
    local_f28[0] = (pointer)local_ef8;
    builtin_strncpy((char *)(local_f38._0_8_ + 0x1f),"st int s",8);
    builtin_strncpy((char *)(local_f38._0_8_ + 0x27),"c0 = -3;",8);
    *(undefined8 *)(local_f38._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_f38._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_f38._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_f38._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_f38._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_f38._0_8_ + 0xc),"ant_",4);
    local_f38.value.m_data = (deUint64)local_ef8;
    *(char *)(local_f38._0_8_ + (long)local_ef8) = '\0';
    local_f90._0_4_ = 1;
    local_f88._M_p = (pointer)&local_f78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f88,local_f38._0_8_,(pointer)((long)local_ef8 + local_f38._0_8_));
    local_f68 = 4;
    local_f60.m_data = 0x21;
    local_f58._0_8_ = local_f48;
    local_d68 = (undefined1  [8])0x2f;
    local_f58._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f58,(ulong)local_d68);
    local_f48[0] = (pointer)local_d68;
    builtin_strncpy((char *)(local_f58._0_8_ + 0x1f),"st int s",8);
    builtin_strncpy((char *)(local_f58._0_8_ + 0x27),"c1 = 91;",8);
    *(undefined8 *)(local_f58._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_f58._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_f58._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_f58._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_f58._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_f58._0_8_ + 0xc),"ant_",4);
    local_f58.value.m_data = (deUint64)local_d68;
    *(char *)(local_f58._0_8_ + (long)local_d68) = '\0';
    local_ef8._0_4_ = 2;
    local_ef0._M_p = local_ee8 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ef0,local_f58._0_8_,(pointer)((long)local_d68 + local_f58._0_8_));
    local_ed0 = 0;
    local_ec8.m_data = 0;
    local_cf8._0_8_ = local_ce8;
    local_dc0 = (undefined1  [8])0x2f;
    local_cf8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_cf8,(ulong)local_dc0);
    local_ce8[0] = (pointer)local_dc0;
    builtin_strncpy((char *)(local_cf8._0_8_ + 0x1f),"st int s",8);
    builtin_strncpy((char *)(local_cf8._0_8_ + 0x27),"c2 = 17;",8);
    *(undefined8 *)(local_cf8._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_cf8._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_cf8._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_cf8._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_cf8._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_cf8._0_8_ + 0xc),"ant_",4);
    local_cf8.value.m_data = (deUint64)local_dc0;
    *(char *)(local_cf8._0_8_ + (long)local_dc0) = '\0';
    local_d68._0_4_ = 3;
    local_d60._M_p = local_d58 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d60,local_cf8._0_8_,(char *)(local_cf8._0_8_ + (long)local_dc0));
    local_d40 = 4;
    local_d38.m_data = 0xfffffff1;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_cb0,(SpecConstant *)local_f90,(SpecConstant *)local_ef8,
               (SpecConstant *)local_d68);
    local_998._56_8_ = 0xc;
    local_958._M_p = (pointer)local_cb8;
    local_dc0 = (undefined1  [8])0x24;
    local_958._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_a60,(ulong)local_dc0);
    local_948._M_allocated_capacity = (size_type)local_dc0;
    builtin_strncpy(local_958._M_p,"    int r0;\n    int r1;\n    int r2;\n",0x24);
    local_950 = (pointer)local_dc0;
    local_958._M_p[(long)local_dc0] = '\0';
    local_938._M_p = (pointer)local_cc0;
    local_930 = 0;
    local_928._M_local_buf[0] = '\0';
    local_918._M_p = (pointer)local_cc8;
    local_dc0 = (undefined1  [8])0x3f;
    local_918._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_a68,(ulong)local_dc0);
    this_00 = local_a70;
    local_908._M_allocated_capacity = (size_type)local_dc0;
    builtin_strncpy(local_918._M_p,
                    "    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n    sb_out.r2 = sc2;\n",0x3f);
    local_910 = (pointer)local_dc0;
    local_918._M_p[(long)local_dc0] = '\0';
    local_458.size = 4;
    local_458.offset = 0;
    local_458.value.m_data = 0x21;
    local_468.size = 4;
    local_468.offset = 4;
    local_468.value.m_data = 0x5b;
    local_478.size = 4;
    local_478.offset = 8;
    local_478.value.m_data = 0xfffffff1;
    (local_a70->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_a70->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_a70->
    super__Vector_base<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::reserve(local_a70,3);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_458);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_468);
    std::
    vector<vkt::pipeline::(anonymous_namespace)::OffsetValue,_std::allocator<vkt::pipeline::(anonymous_namespace)::OffsetValue>_>
    ::push_back(this_00,&local_478);
    local_8e0 = 0;
    local_8d8 = local_be0;
    local_8d0 = 4;
    local_8c8[0] = CONCAT35(local_8c8[0]._5_3_,0x746e6975);
    local_fb0._0_8_ = local_fa0;
    local_e18 = (undefined1  [8])0x31;
    local_fb0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_fb0,(ulong)local_e18);
    local_fa0[0] = (pointer)local_e18;
    *(undefined8 *)(local_fb0._0_8_ + 0x20) = 0x7320746e69752074;
    *(undefined8 *)(local_fb0._0_8_ + 0x28) = 0x753234203d203063;
    *(undefined8 *)(local_fb0._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_fb0._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_fb0._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_fb0._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_fb0._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_fb0._0_8_ + 0xc),"ant_",4);
    *(char *)(local_fb0._0_8_ + 0x30) = ';';
    local_fb0.value.m_data = (deUint64)local_e18;
    *(char *)(local_fb0._0_8_ + (long)local_e18) = '\0';
    local_dc0._0_4_ = 1;
    local_db8._M_p = (pointer)&local_da8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_db8,local_fb0._0_8_,(char *)(local_fb0._0_8_ + (long)local_e18));
    local_d98 = 4;
    local_d90.m_data = 0x61;
    local_c80 = local_c70;
    local_e50 = (undefined1  [8])0x30;
    local_c80 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_c80,(ulong)local_e50);
    local_c70[0] = (ulong)local_e50;
    local_c80[4] = 0x7320746e69752074;
    local_c80[5] = 0x3b7537203d203163;
    local_c80[2] = 0x497b24203d206469;
    local_c80[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_c80 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_c80 + 4),"ut(c",4);
    *(undefined4 *)(local_c80 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_c80 + 0xc),"ant_",4);
    local_c78 = (ulong)local_e50;
    *(char *)((long)local_c80 + (long)local_e50) = '\0';
    local_e18._0_4_ = 2;
    local_e10._M_p = (pointer)&local_e00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e10,local_c80,(char *)((long)local_c80 + (long)local_e50));
    local_df0 = 0;
    local_de8.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_bf0,(SpecConstant *)local_dc0,(SpecConstant *)local_e18);
    local_8a0 = 8;
    local_898 = local_bf8;
    local_e50 = (undefined1  [8])0x1a;
    local_898 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_3f8,(ulong)local_e50);
    local_888 = (pointer)local_e50;
    builtin_strncpy((char *)local_898,"    uint r0;\n    uint r1;\n",0x1a);
    local_890 = (pointer)local_e50;
    *(char *)((long)local_898 + (long)local_e50) = '\0';
    local_878 = local_c00;
    local_870 = 0;
    local_868[0] = 0;
    local_858 = local_c08;
    local_e50 = (undefined1  [8])0x2a;
    local_858 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4c0,(ulong)local_e50);
    local_848[0] = (pointer)local_e50;
    builtin_strncpy((char *)local_858,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_850 = (pointer)local_e50;
    *(char *)((long)local_858 + (long)local_e50) = '\0';
    local_488.size = 4;
    local_488.offset = 0;
    local_488.value.m_data = 0x61;
    local_498.size = 4;
    local_498.offset = 4;
    local_498.value.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4c8,&local_488,&local_498);
    local_820 = 0;
    local_818 = local_be8;
    *(char *)((long)local_be8 + 4) = 't';
    *(undefined4 *)local_be8 = 0x616f6c66;
    local_810 = (pointer)0x5;
    local_808[0]._0_6_ = (uint6)(uint5)local_808[0];
    local_de0 = local_dd0;
    local_e88 = (undefined1  [8])0x32;
    local_de0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_de0,(ulong)local_e88);
    local_dd0[0] = (ulong)local_e88;
    local_de0[4] = 0x2074616f6c662074;
    local_de0[5] = 0x2e37203d20306373;
    local_de0[2] = 0x497b24203d206469;
    local_de0[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_de0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_de0 + 4),"ut(c",4);
    *(undefined4 *)(local_de0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_de0 + 0xc),"ant_",4);
    *(undefined2 *)(local_de0 + 6) = 0x3b35;
    local_dd8 = (ulong)local_e88;
    *(char *)((long)local_de0 + (long)local_e88) = '\0';
    local_e50._0_4_ = 1;
    local_e48._M_p = (pointer)&local_e38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e48,local_de0,(char *)((long)local_de0 + (long)local_e88));
    local_e28 = 4;
    local_e20.m_data = 0x417c0000;
    local_ca0 = local_c90;
    local_ec0 = (undefined1  [8])0x34;
    local_ca0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_ca0,(ulong)local_ec0);
    local_c90[0] = (ulong)local_ec0;
    local_ca0[4] = 0x2074616f6c662074;
    local_ca0[5] = 0x2e31203d20316373;
    local_ca0[2] = 0x497b24203d206469;
    local_ca0[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_ca0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_ca0 + 4),"ut(c",4);
    *(undefined4 *)(local_ca0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_ca0 + 0xc),"ant_",4);
    *(undefined4 *)(local_ca0 + 6) = 0x3b353231;
    local_c98 = (ulong)local_ec0;
    *(char *)((long)local_ca0 + (long)local_ec0) = '\0';
    local_e88._0_4_ = 2;
    local_e80._M_p = (pointer)&local_e70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e80,local_ca0,(char *)((long)local_ca0 + (long)local_ec0));
    local_e60 = 0;
    local_e58.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_c18,(SpecConstant *)local_e50,(SpecConstant *)local_e88);
    local_7e0 = 8;
    local_7d8 = local_c20;
    local_ec0 = (undefined1  [8])0x1c;
    local_7d8 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_400,(ulong)local_ec0);
    local_7c8 = (ulong)local_ec0;
    builtin_strncpy((char *)local_7d8,"    float r0;\n    float r1;\n",0x1c);
    local_7d0 = (ulong)local_ec0;
    *(char *)((long)local_7d8 + (long)local_ec0) = '\0';
    local_7b8 = local_c28;
    local_7b0 = 0;
    local_7a8[0] = 0;
    local_798 = local_c30;
    local_ec0 = (undefined1  [8])0x2a;
    local_798 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4d0,(ulong)local_ec0);
    local_788[0] = (pointer)local_ec0;
    builtin_strncpy((char *)local_798,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_790 = (pointer)local_ec0;
    *(char *)((long)local_798 + (long)local_ec0) = '\0';
    local_bc8.size = 4;
    local_bc8.offset = 0;
    local_bc8.value.m_data = 0x417c0000;
    local_360.size = 4;
    local_360.offset = 4;
    local_360.value.m_data = 0x3f900000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4d8,&local_bc8,&local_360);
    local_760 = 0;
    local_758 = local_c10;
    ((char *)((long)local_c10 + 4))[0] = 'l';
    ((char *)((long)local_c10 + 4))[1] = 'e';
    *(undefined4 *)local_c10 = 0x62756f64;
    local_750 = 6;
    local_748[0]._0_7_ = (uint7)(uint6)local_748[0];
    local_b90._0_8_ = local_b80;
    local_d30 = (undefined1  [8])0x36;
    local_b90._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_b90,(ulong)local_d30);
    local_b80[0] = (ulong)local_d30;
    *(undefined8 *)(local_b90._0_8_ + 0x20) = 0x656c62756f642074;
    *(undefined8 *)(local_b90._0_8_ + 0x28) = 0x32203d2030637320;
    *(undefined8 *)(local_b90._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_b90._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_b90._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_b90._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_b90._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_b90._0_8_ + 0xc),"ant_",4);
    builtin_strncpy((char *)(local_b90._0_8_ + 0x2e)," 2.75LF;",8);
    local_b90.value.m_data = (deUint64)local_d30;
    *(char *)(local_b90._0_8_ + (long)local_d30) = '\0';
    local_ec0._0_4_ = 1;
    local_eb8._M_p = (pointer)&local_ea8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_eb8,local_b90._0_8_,(char *)(local_b90._0_8_ + (long)local_d30));
    local_e98 = 8;
    local_e90.m_data = 0x4036800000000000;
    local_bb0._0_8_ = local_ba0;
    local_b50._0_8_ = (pointer *)0x36;
    local_bb0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_bb0,(ulong)&local_b50);
    local_ba0[0] = (pointer *)local_b50._0_8_;
    *(undefined8 *)(local_bb0._0_8_ + 0x20) = 0x656c62756f642074;
    *(undefined8 *)(local_bb0._0_8_ + 0x28) = 0x39203d2031637320;
    *(undefined8 *)(local_bb0._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_bb0._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_bb0._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_bb0._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_bb0._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_bb0._0_8_ + 0xc),"ant_",4);
    builtin_strncpy((char *)(local_bb0._0_8_ + 0x2e)," 9.25LF;",8);
    local_bb0.value.m_data._0_4_ = local_b50.size;
    local_bb0.value.m_data._4_4_ = local_b50.offset;
    *(char *)(local_bb0._0_8_ + local_b50._0_8_) = '\0';
    local_d30._0_4_ = 2;
    local_d28._M_p = (pointer)&local_d18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d28,local_bb0._0_8_,(char *)(local_bb0._0_8_ + local_b50._0_8_));
    local_d08 = 0;
    local_d00.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_c38,(SpecConstant *)local_ec0,(SpecConstant *)local_d30);
    local_720 = 0x10;
    local_718 = local_c40;
    local_b50._0_8_ = (pointer *)0x1e;
    local_718 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_408,(ulong)&local_b50);
    local_708 = (pointer *)local_b50._0_8_;
    builtin_strncpy((char *)local_718,"    double r0;\n    double r1;\n",0x1e);
    local_710 = (pointer *)local_b50._0_8_;
    *(char *)((long)local_718 + local_b50._0_8_) = '\0';
    local_6f8 = local_c48;
    local_6f0 = 0;
    local_6e8[0] = 0;
    local_6d8 = local_c50;
    local_b50._0_8_ = (pointer *)0x2a;
    local_6d8 = (pointer **)std::__cxx11::string::_M_create((ulong *)local_4e0,(ulong)&local_b50);
    local_6c8[0] = (pointer *)local_b50._0_8_;
    builtin_strncpy((char *)local_6d8,"    sb_out.r0 = sc0;\n    sb_out.r1 = sc1;\n",0x2a);
    local_6d0 = (pointer *)local_b50._0_8_;
    *(char *)((long)local_6d8 + local_b50._0_8_) = '\0';
    local_b50.size = 8;
    local_b50.offset = 0;
    local_b50.value.m_data = 0x4036800000000000;
    local_370.size = 8;
    local_370.offset = 8;
    local_370.value.m_data = 0x4022800000000000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4e8,&local_b50,&local_370);
    local_6a0 = 4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d28._M_p != &local_d18) {
      operator_delete(local_d28._M_p,local_d18._M_allocated_capacity + 1);
    }
    if ((pointer **)local_bb0._0_8_ != local_ba0) {
      operator_delete((void *)local_bb0._0_8_,(long)local_ba0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_eb8._M_p != &local_ea8) {
      operator_delete(local_eb8._M_p,local_ea8._M_allocated_capacity + 1);
    }
    if ((ulong *)local_b90._0_8_ != local_b80) {
      operator_delete((void *)local_b90._0_8_,local_b80[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e80._M_p != &local_e70) {
      operator_delete(local_e80._M_p,local_e70._M_allocated_capacity + 1);
    }
    if (local_ca0 != local_c90) {
      operator_delete(local_ca0,local_c90[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e48._M_p != &local_e38) {
      operator_delete(local_e48._M_p,local_e38._M_allocated_capacity + 1);
    }
    if (local_de0 != local_dd0) {
      operator_delete(local_de0,local_dd0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e10._M_p != &local_e00) {
      operator_delete(local_e10._M_p,local_e00._M_allocated_capacity + 1);
    }
    if (local_c80 != local_c70) {
      operator_delete(local_c80,local_c70[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_db8._M_p != &local_da8) {
      operator_delete(local_db8._M_p,local_da8._M_allocated_capacity + 1);
    }
    if ((pointer *)local_fb0._0_8_ != local_fa0) {
      operator_delete((void *)local_fb0._0_8_,(ulong)(local_fa0[0] + 1));
    }
    if (local_d60._M_p != local_d58 + 8) {
      operator_delete(local_d60._M_p,local_d58._8_8_ + 1);
    }
    if ((pointer *)local_cf8._0_8_ != local_ce8) {
      operator_delete((void *)local_cf8._0_8_,(ulong)(local_ce8[0] + 1));
    }
    if (local_ef0._M_p != local_ee8 + 8) {
      operator_delete(local_ef0._M_p,local_ee8._8_8_ + 1);
    }
    if ((pointer *)local_f58._0_8_ != local_f48) {
      operator_delete((void *)local_f58._0_8_,(ulong)(local_f48[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f88._M_p != &local_f78) {
      operator_delete(local_f88._M_p,local_f78._M_allocated_capacity + 1);
    }
    if ((pointer *)local_f38._0_8_ != local_f28) {
      operator_delete((void *)local_f38._0_8_,(ulong)(local_f28[0] + 1));
    }
    if (local_1008._M_p != local_1000 + 8) {
      operator_delete(local_1008._M_p,local_1000._8_8_ + 1);
    }
    if ((pointer *)local_f18._0_8_ != local_f08) {
      operator_delete((void *)local_f18._0_8_,(ulong)(local_f08[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1068._M_p != &local_1058) {
      operator_delete(local_1068._M_p,local_1058._M_allocated_capacity + 1);
    }
    if ((pointer *)local_d88._0_8_ != local_d78) {
      operator_delete((void *)local_d88._0_8_,(ulong)(local_d78[0] + 1));
    }
    if (local_b38._M_p != local_b28) {
      operator_delete(local_b38._M_p,local_b28._0_8_ + 1);
    }
    if ((pointer *)local_fd0._0_8_ != local_fc0) {
      operator_delete((void *)local_fd0._0_8_,(ulong)(local_fc0[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    if (local_1038 != local_1028) {
      operator_delete(local_1038,(long)local_1028[0] + 1);
    }
    lVar16 = 0;
    do {
      pSVar7 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar7,local_1080,stage,(CaseDefinition *)(local_a58 + lVar16));
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      lVar16 = lVar16 + 0xc0;
    } while (lVar16 != 0x3c0);
    lVar16 = 0x300;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_a58 + lVar16));
      lVar16 = lVar16 + -0xc0;
    } while (lVar16 != -0xc0);
    tcu::TestNode::addChild(local_c60,pTVar6);
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_1080,"builtin","built-in override");
    local_a58._0_8_ = local_a58 + 0x10;
    local_a58._16_8_ = 0x746c7561666564;
    local_a58._8_8_ = 7;
    local_1070 = (undefined1  [8])&local_1060;
    local_b40 = (undefined1  [8])0x2d;
    local_1070 = (undefined1  [8])
                 std::__cxx11::string::_M_create((ulong *)local_1070,(ulong)local_b40);
    local_1060 = (pointer)local_b40;
    builtin_strncpy((char *)((long)local_1070 + 0x1d),"l_MaxIma",8);
    builtin_strncpy((char *)((long)local_1070 + 0x25),"geUnits;",8);
    *(undefined8 *)((long)local_1070 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_1070 + 0x18) = 0x4d5f6c6720297d44;
    *(undefined4 *)local_1070 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_1070 + 4),"ut(c",4);
    *(undefined4 *)((long)local_1070 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_1070 + 0xc),"ant_",4);
    local_1068._M_p = (pointer)local_b40;
    *(char *)((long)local_1070 + (long)local_b40) = '\0';
    local_350._0_4_ = 1;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_1070,(pointer)((long)local_b40 + (long)local_1070));
    local_328 = 0;
    local_320.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_a58 + 0x20),(SpecConstant *)local_350);
    local_a58._56_8_ = 4;
    local_a18._M_p = (pointer)&local_a08;
    local_a08._8_5_ = 0xa3b6b6f20;
    local_a08._M_allocated_capacity._0_5_ = 0x6220202020;
    local_a08._M_allocated_capacity._5_3_ = 0x6c6f6f;
    local_a10 = (pointer)0xd;
    local_a08._M_local_buf[0xd] = '\0';
    local_9f8._M_p = (pointer)&local_9e8;
    local_9f0 = (pointer)0x0;
    local_9e8._M_allocated_capacity = local_9e8._M_allocated_capacity & 0xffffffffffffff00;
    local_9d8._M_p = (pointer)local_1018;
    local_b40 = (undefined1  [8])0x29;
    local_9d8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_bd0,(ulong)local_b40);
    local_9c8._M_allocated_capacity = (size_type)local_b40;
    builtin_strncpy(local_9d8._M_p,"    sb_out.ok = (gl_MaxImageUnits >= 8);\n",0x29);
    local_9d0 = (pointer)local_b40;
    local_9d8._M_p[(long)local_b40] = '\0';
    local_f90 = (undefined1  [8])0x4;
    local_f88._M_p = &DAT_00000001;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_bd8,(OffsetValue *)local_f90);
    local_9a0 = 0;
    local_998._0_8_ = local_ca8;
    builtin_strncpy(local_ca8,"specialized",0xb);
    local_998._8_8_ = 0xb;
    local_998[0x1b] = '\0';
    local_1010 = (undefined1  [8])local_1000;
    local_ef8 = (undefined1  [8])0x2d;
    local_1010 = (undefined1  [8])
                 std::__cxx11::string::_M_create((ulong *)local_1010,(ulong)local_ef8);
    local_1000._0_8_ = local_ef8;
    builtin_strncpy((char *)local_1010,"layout(constant_id = ${ID}) gl_MaxImageUnits;",0x2d);
    local_1008._M_p = (pointer)local_ef8;
    *(char *)((long)local_1010 + (long)local_ef8) = '\0';
    local_b40._0_4_ = 1;
    local_b38._M_p = local_b28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b38,local_1010,(pointer)((long)local_ef8 + (long)local_1010));
    local_b18 = 4;
    local_b10.m_data = 0xc;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_cb0,(SpecConstant *)local_b40);
    local_998._56_8_ = 4;
    local_958._M_p = (pointer)local_cb8;
    local_ef8 = (undefined1  [8])0x17;
    local_958._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_a60,(ulong)local_ef8);
    local_948._M_allocated_capacity = (size_type)local_ef8;
    builtin_strncpy(local_958._M_p,"    int maxImageUnits;\n",0x17);
    local_950 = (pointer)local_ef8;
    local_958._M_p[(long)local_ef8] = '\0';
    local_938._M_p = (pointer)local_cc0;
    local_930 = 0;
    local_928._M_local_buf[0] = '\0';
    local_918._M_p = (pointer)local_cc8;
    local_ef8 = (undefined1  [8])0x2d;
    local_918._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_a68,(ulong)local_ef8);
    local_908._M_allocated_capacity = (size_type)local_ef8;
    builtin_strncpy(local_918._M_p,"    sb_out.maxImageUnits = gl_MaxImageUnits;\n",0x2d);
    local_910 = (pointer)local_ef8;
    local_918._M_p[(long)local_ef8] = '\0';
    local_ef8 = (undefined1  [8])0x4;
    local_ef0._M_p = (pointer)0xc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_a70,(OffsetValue *)local_ef8);
    local_8e0 = 0;
    if (local_b38._M_p != local_b28) {
      operator_delete(local_b38._M_p,local_b28._0_8_ + 1);
    }
    if (local_1010 != (undefined1  [8])local_1000) {
      operator_delete((void *)local_1010,(ulong)(local_1000._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    if (local_1070 != (undefined1  [8])&local_1060) {
      operator_delete((void *)local_1070,(ulong)(local_1060 + 1));
    }
    pCVar13 = (CaseDefinition *)local_a58;
    bVar3 = true;
    do {
      bVar17 = bVar3;
      pSVar7 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest(pSVar7,local_1080,stage,pCVar13);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      pCVar13 = (CaseDefinition *)local_998;
      bVar3 = false;
    } while (bVar17);
    lVar16 = 0xc0;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_a58 + lVar16));
      lVar16 = lVar16 + -0xc0;
    } while (lVar16 != -0xc0);
    tcu::TestNode::addChild(local_c60,pTVar6);
    local_1074 = *(VkShaderStageFlagBits *)(local_3f0 + 2);
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,local_1080,"expression",
               "specialization constants usage in expressions");
    local_a58._0_8_ = local_a58 + 0x10;
    local_350 = (undefined1  [8])0x15;
    local_a58._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a58,(ulong)local_350);
    local_a58._16_8_ = local_350;
    builtin_strncpy((char *)local_a58._0_8_,"spec_const_expression",0x15);
    local_a58._8_8_ = local_350;
    *(char *)(local_a58._0_8_ + (long)local_350) = '\0';
    local_d30 = (undefined1  [8])&local_d20;
    local_b40 = (undefined1  [8])0x2e;
    local_d30 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_d30,(ulong)local_b40);
    local_d20 = (pointer)local_b40;
    builtin_strncpy((char *)((long)local_d30 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_d30 + 0x26),"sc0 = 2;",8);
    *(undefined8 *)((long)local_d30 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_d30 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_d30 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_d30 + 4),"ut(c",4);
    *(undefined4 *)((long)local_d30 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_d30 + 0xc),"ant_",4);
    local_d28._M_p = (pointer)local_b40;
    *(char *)((long)local_d30 + (long)local_b40) = '\0';
    local_350._0_4_ = 1;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_d30,(pointer)((long)local_b40 + (long)local_d30));
    local_328 = 0;
    local_320.m_data = 0;
    local_1038 = local_1028;
    local_1070 = (undefined1  [8])0x2e;
    local_1038 = (pointer **)std::__cxx11::string::_M_create((ulong *)&local_1038,(ulong)local_1070)
    ;
    local_1028[0] = (pointer *)local_1070;
    builtin_strncpy((char *)((long)local_1038 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_1038 + 0x26),"sc1 = 3;",8);
    local_1038[2] = (pointer *)0x497b24203d206469;
    local_1038[3] = (pointer *)0x736e6f6320297d44;
    *(undefined4 *)local_1038 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_1038 + 4),"ut(c",4);
    *(undefined4 *)(local_1038 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_1038 + 0xc),"ant_",4);
    local_1030 = (pointer *)local_1070;
    *(char *)((long)local_1038 + (long)local_1070) = '\0';
    local_b40._0_4_ = 2;
    local_b38._M_p = local_b28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b38,local_1038,(char *)((long)local_1070 + (long)local_1038));
    local_b18 = 4;
    local_b10.m_data = 5;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_a58 + 0x20),(SpecConstant *)local_350,(SpecConstant *)local_b40);
    local_a58._56_8_ = 4;
    local_a18._M_p = (pointer)&local_a08;
    local_1070 = (undefined1  [8])0x10;
    local_a18._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_a18,(ulong)local_1070)
    ;
    local_a08._M_allocated_capacity._0_5_ = local_1070._0_5_;
    local_a08._M_allocated_capacity._5_3_ = local_1070._5_3_;
    builtin_strncpy(local_a18._M_p,"    int result;\n",0x10);
    local_a10 = (pointer)local_1070;
    local_a18._M_p[(long)local_1070] = '\0';
    local_9f8._M_p = (pointer)&local_9e8;
    local_1070 = (undefined1  [8])0x38;
    local_9f8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_9f8,(ulong)local_1070)
    ;
    local_9e8._M_allocated_capacity = (size_type)local_1070;
    builtin_strncpy(local_9f8._M_p,"const int expr0 = sc0 + 1;\nconst int expr1 = sc0 + sc1;\n",0x38
                   );
    local_9f0 = (pointer)local_1070;
    local_9f8._M_p[(long)local_1070] = '\0';
    local_9d8._M_p = (pointer)local_1018;
    local_1070 = (undefined1  [8])0x23;
    local_9d8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_bd0,(ulong)local_1070);
    local_9c8._M_allocated_capacity = (size_type)local_1070;
    builtin_strncpy(local_9d8._M_p,"    sb_out.result = expr0 + expr1;\n",0x23);
    local_9d0 = (pointer)local_1070;
    local_9d8._M_p[(long)local_1070] = '\0';
    local_b90._0_8_ = (ulong *)0x4;
    local_b90.value.m_data = 10;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_bd8,&local_b90);
    local_9a0 = 0;
    local_998._0_8_ = local_ca8;
    builtin_strncpy(local_ca8,"array_size",10);
    local_998._8_8_ = 10;
    local_998[0x1a] = '\0';
    local_fd0._0_8_ = local_fc0;
    local_1010 = (undefined1  [8])0x2e;
    local_fd0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_fd0,(ulong)local_1010);
    local_fc0[0] = (pointer)local_1010;
    builtin_strncpy((char *)(local_fd0._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_fd0._0_8_ + 0x26),"sc0 = 1;",8);
    *(undefined8 *)(local_fd0._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_fd0._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_fd0._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_fd0._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_fd0._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_fd0._0_8_ + 0xc),"ant_",4);
    local_fd0.value.m_data = (deUint64)local_1010;
    *(char *)(local_fd0._0_8_ + (long)local_1010) = '\0';
    local_1070._0_4_ = 1;
    local_1068._M_p = (pointer)&local_1058;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1068,local_fd0._0_8_,(pointer)((long)local_1010 + local_fd0._0_8_));
    local_1048 = 0;
    local_1040.m_data = 0;
    local_d88._0_8_ = local_d78;
    local_f90 = (undefined1  [8])0x2e;
    local_d88._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_d88,(ulong)local_f90);
    local_d78[0] = (pointer)local_f90;
    builtin_strncpy((char *)(local_d88._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_d88._0_8_ + 0x26),"sc1 = 2;",8);
    *(undefined8 *)(local_d88._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_d88._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_d88._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_d88._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_d88._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_d88._0_8_ + 0xc),"ant_",4);
    local_d88.value.m_data = (deUint64)local_f90;
    *(char *)(local_d88._0_8_ + (long)local_f90) = '\0';
    local_1010._0_4_ = 2;
    local_1008._M_p = local_1000 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1008,local_d88._0_8_,(pointer)((long)local_f90 + local_d88._0_8_));
    local_fe8 = 4;
    local_fe0.m_data = 3;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_cb0,(SpecConstant *)local_1070,(SpecConstant *)local_1010);
    local_998._56_8_ = 0x10;
    local_958._M_p = (pointer)local_cb8;
    local_f90 = (undefined1  [8])0x1b;
    local_958._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_a60,(ulong)local_f90);
    local_948._M_allocated_capacity = (size_type)local_f90;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xb) = '\n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xc) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xd) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xe) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xf) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x10) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x11) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x12) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x13) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x14) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x15) = '1';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x16) = '[';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x17) = '3';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x18) = ']';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x19) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0x1a) = '\n';
    *(undefined8 *)local_958._M_p = 0x20746e6920202020;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 8) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 9) = '0';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 10) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xb) = '\n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xc) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xd) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xe) = ' ';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_958._M_p + 0xf) = ' ';
    local_950 = (pointer)local_f90;
    local_958._M_p[(long)local_f90] = '\0';
    local_938._M_p = (pointer)local_cc0;
    local_930 = 0;
    local_928._M_local_buf[0] = '\0';
    local_918._M_p = (pointer)local_cc8;
    local_f90 = (undefined1  [8])0xef;
    local_918._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_a68,(ulong)local_f90);
    auVar1 = local_f90;
    local_908._M_allocated_capacity = (size_type)local_f90;
    memcpy(local_918._M_p,
           "    int a0[sc0];\n    int a1[sc1];\n\n    for (int i = 0; i < sc0; ++i)\n        a0[i] = sc0 - i;\n    for (int i = 0; i < sc1; ++i)\n        a1[i] = sc1 - i;\n\n    sb_out.r0 = a0[0];\n    for (int i = 0; i < sc1; ++i)\n\t     sb_out.r1[i] = a1[i];\n"
           ,0xef);
    local_910 = (pointer)auVar1;
    local_918._M_p[(long)auVar1] = '\0';
    local_bb0._0_8_ = (pointer **)0x4;
    local_bb0.value.m_data = 1;
    local_4b8._0_8_ = (deUint64 *)0x400000004;
    local_4b8.value.m_data = 3;
    local_428.size = 4;
    local_428.offset = 8;
    local_428.value.m_data = 2;
    local_438.size = 4;
    local_438.offset = 0xc;
    local_438.value.m_data = 1;
    o4 = &local_438;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_a70,&local_bb0,&local_4b8,&local_428,o4);
    local_8e0 = 0;
    local_8d8 = local_be0;
    local_f90 = (undefined1  [8])0x15;
    local_8d8 = (long *)std::__cxx11::string::_M_create((ulong *)local_410,(ulong)local_f90);
    local_8c8[0] = (long)local_f90;
    *local_8d8 = 0x69735f7961727261;
    local_8d8[1] = 0x65727078655f657a;
    builtin_strncpy((char *)((long)local_8d8 + 0xd),"pression",8);
    local_8d0 = (long)local_f90;
    *(char *)((long)local_8d8 + (long)local_f90) = '\0';
    local_f18._0_8_ = local_f08;
    local_ef8 = (undefined1  [8])0x2e;
    local_f18._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f18,(ulong)local_ef8);
    local_f08[0] = (pointer)local_ef8;
    builtin_strncpy((char *)(local_f18._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_f18._0_8_ + 0x26),"sc0 = 3;",8);
    *(undefined8 *)(local_f18._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_f18._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_f18._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_f18._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_f18._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_f18._0_8_ + 0xc),"ant_",4);
    local_f18.value.m_data = (deUint64)local_ef8;
    *(char *)(local_f18._0_8_ + (long)local_ef8) = '\0';
    local_f90._0_4_ = 1;
    local_f88._M_p = (pointer)&local_f78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f88,local_f18._0_8_,(pointer)((long)local_ef8 + local_f18._0_8_));
    local_f68 = 0;
    local_f60.m_data = 0;
    local_f38._0_8_ = local_f28;
    local_d68 = (undefined1  [8])0x2e;
    local_f38._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f38,(ulong)local_d68);
    local_f28[0] = (pointer)local_d68;
    builtin_strncpy((char *)(local_f38._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_f38._0_8_ + 0x26),"sc1 = 5;",8);
    *(undefined8 *)(local_f38._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_f38._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_f38._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_f38._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_f38._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_f38._0_8_ + 0xc),"ant_",4);
    local_f38.value.m_data = (deUint64)local_d68;
    *(char *)(local_f38._0_8_ + (long)local_d68) = '\0';
    local_ef8._0_4_ = 2;
    local_ef0._M_p = local_ee8 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ef0,local_f38._0_8_,(pointer)((long)local_d68 + local_f38._0_8_));
    local_ed0 = 4;
    local_ec8.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_bf0,(SpecConstant *)local_f90,(SpecConstant *)local_ef8);
    local_8a0 = 8;
    local_898 = local_bf8;
    local_d68 = (undefined1  [8])0x18;
    local_898 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_3f8,(ulong)local_d68);
    local_888 = (pointer)local_d68;
    *local_898 = (pointer)0x20746e6920202020;
    local_898[1] = (pointer)0x202020200a3b3072;
    local_898[2] = (pointer)0xa3b317220746e69;
    local_890 = (pointer)local_d68;
    *(char *)((long)local_898 + (long)local_d68) = '\0';
    local_878 = local_c00;
    local_870 = 0;
    local_868[0] = 0;
    local_858 = local_c08;
    local_d68 = (undefined1  [8])0x123;
    local_858 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4c0,(ulong)local_d68);
    auVar1 = local_d68;
    local_848[0] = (pointer)local_d68;
    memcpy(local_858,
           "    int a0[sc0 + 3];\n    int a1[sc0 + sc1];\n\n    const int size0 = sc0 + 3;\n    const int size1 = sc0 + sc1;\n\n    for (int i = 0; i < size0; ++i)\n        a0[i] = 3 - i;\n    for (int i = 0; i < size1; ++i)\n        a1[i] = 5 - i;\n\n    sb_out.r0 = a0[size0 - 1];\n    sb_out.r1 = a1[size1 - 1];\n"
           ,0x123);
    local_850 = (pointer)auVar1;
    *(char *)((long)local_858 + (long)auVar1) = '\0';
    local_448.size = 4;
    local_448.offset = 0;
    local_448.value.m_data = 0xfffffffe;
    local_458.size = 4;
    local_458.offset = 4;
    local_458.value.m_data = 0xfffffffc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4c8,&local_448,&local_458);
    local_820 = 0;
    local_818 = local_be8;
    local_d68 = (undefined1  [8])0x20;
    local_818 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_418,(ulong)local_d68);
    local_808[0] = (pointer)local_d68;
    local_818[2] = (pointer)0x78655f74736e6f63;
    local_818[3] = (pointer)0x6e6f697373657270;
    *local_818 = (pointer)0x69735f7961727261;
    local_818[1] = (pointer)0x5f636570735f657a;
    local_810 = (pointer)local_d68;
    *(char *)((long)local_818 + (long)local_d68) = '\0';
    local_f58._0_8_ = local_f48;
    local_dc0 = (undefined1  [8])0x2e;
    local_f58._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f58,(ulong)local_dc0);
    local_f48[0] = (pointer)local_dc0;
    builtin_strncpy((char *)(local_f58._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_f58._0_8_ + 0x26),"sc0 = 3;",8);
    *(undefined8 *)(local_f58._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_f58._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_f58._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_f58._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_f58._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_f58._0_8_ + 0xc),"ant_",4);
    local_f58.value.m_data = (deUint64)local_dc0;
    *(char *)(local_f58._0_8_ + (long)local_dc0) = '\0';
    local_d68._0_4_ = 1;
    local_d60._M_p = local_d58 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d60,local_f58._0_8_,(char *)(local_f58._0_8_ + (long)local_dc0));
    local_d40 = 0;
    local_d38.m_data = 0;
    local_cf8._0_8_ = local_ce8;
    local_e18 = (undefined1  [8])0x2e;
    local_cf8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_cf8,(ulong)local_e18);
    local_ce8[0] = (pointer)local_e18;
    builtin_strncpy((char *)(local_cf8._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_cf8._0_8_ + 0x26),"sc1 = 5;",8);
    *(undefined8 *)(local_cf8._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_cf8._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_cf8._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_cf8._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_cf8._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_cf8._0_8_ + 0xc),"ant_",4);
    local_cf8.value.m_data = (deUint64)local_e18;
    *(char *)(local_cf8._0_8_ + (long)local_e18) = '\0';
    local_dc0._0_4_ = 2;
    local_db8._M_p = (pointer)&local_da8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_db8,local_cf8._0_8_,(pointer)((long)local_e18 + local_cf8._0_8_));
    local_d98 = 4;
    local_d90.m_data = 7;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_c18,(SpecConstant *)local_d68,(SpecConstant *)local_dc0);
    local_7e0 = 8;
    local_7d8 = local_c20;
    local_e18 = (undefined1  [8])0x18;
    local_7d8 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_400,(ulong)local_e18);
    local_7c8 = (ulong)local_e18;
    *local_7d8 = 0x20746e6920202020;
    local_7d8[1] = 0x202020200a3b3072;
    local_7d8[2] = 0xa3b317220746e69;
    local_7d0 = (ulong)local_e18;
    *(char *)((long)local_7d8 + (long)local_e18) = '\0';
    local_7b8 = local_c28;
    local_7b0 = 0;
    local_7a8[0] = 0;
    local_798 = local_c30;
    local_e18 = (undefined1  [8])0x11d;
    local_798 = (pointer *)std::__cxx11::string::_M_create((ulong *)local_4d0,(ulong)local_e18);
    auVar1 = local_e18;
    local_788[0] = (pointer)local_e18;
    memcpy(local_798,
           "    const int size0 = sc0 + 3;\n    const int size1 = sc0 + sc1;\n\n    int a0[size0];\n    int a1[size1];\n\n    for (int i = 0; i < size0; ++i)\n        a0[i] = 3 - i;\n    for (int i = 0; i < size1; ++i)\n        a1[i] = 5 - i;\n\n    sb_out.r0 = a0[size0 - 1];\n    sb_out.r1 = a1[size1 - 1];\n"
           ,0x11d);
    local_790 = (pointer)auVar1;
    *(char *)((long)local_798 + (long)auVar1) = '\0';
    local_468.size = 4;
    local_468.offset = 0;
    local_468.value.m_data = 0xfffffffe;
    local_478.size = 4;
    local_478.offset = 4;
    local_478.value.m_data = 0xfffffffc;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4d8,&local_468,&local_478);
    local_760 = 0;
    local_758 = local_c10;
    local_e18 = (undefined1  [8])0x11;
    local_758 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_b68,(ulong)local_e18);
    local_748[0] = (ulong)local_e18;
    *local_758 = 0x69735f7961727261;
    local_758[1] = 0x74676e656c5f657a;
    *(char *)(local_758 + 2) = 'h';
    local_750 = (ulong)local_e18;
    *(char *)((long)local_758 + (long)local_e18) = '\0';
    local_fb0._0_8_ = local_fa0;
    local_e50 = (undefined1  [8])0x2e;
    local_fb0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_fb0,(ulong)local_e50);
    local_fa0[0] = (pointer)local_e50;
    builtin_strncpy((char *)(local_fb0._0_8_ + 0x1e),"nst int ",8);
    builtin_strncpy((char *)(local_fb0._0_8_ + 0x26),"sc0 = 1;",8);
    *(undefined8 *)(local_fb0._0_8_ + 0x10) = 0x497b24203d206469;
    *(undefined8 *)(local_fb0._0_8_ + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_fb0._0_8_ = 0x6f79616c;
    builtin_strncpy((char *)(local_fb0._0_8_ + 4),"ut(c",4);
    *(undefined4 *)(local_fb0._0_8_ + 8) = 0x74736e6f;
    builtin_strncpy((char *)(local_fb0._0_8_ + 0xc),"ant_",4);
    local_fb0.value.m_data = (deUint64)local_e50;
    *(char *)(local_fb0._0_8_ + (long)local_e50) = '\0';
    local_e18._0_4_ = 1;
    local_e10._M_p = (pointer)&local_e00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e10,local_fb0._0_8_,(pointer)((long)local_e50 + local_fb0._0_8_));
    local_df0 = 0;
    local_de8.m_data = 0;
    local_c80 = local_c70;
    local_e88 = (undefined1  [8])0x2e;
    local_c80 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_c80,(ulong)local_e88);
    local_c70[0] = (ulong)local_e88;
    builtin_strncpy((char *)((long)local_c80 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_c80 + 0x26),"sc1 = 2;",8);
    local_c80[2] = 0x497b24203d206469;
    local_c80[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_c80 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_c80 + 4),"ut(c",4);
    *(undefined4 *)(local_c80 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_c80 + 0xc),"ant_",4);
    local_c78 = (ulong)local_e88;
    *(char *)((long)local_c80 + (long)local_e88) = '\0';
    local_e50._0_4_ = 2;
    local_e48._M_p = (pointer)&local_e38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e48,local_c80,(char *)((long)local_c80 + (long)local_e88));
    local_e28 = 4;
    local_e20.m_data = 4;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_c38,(SpecConstant *)local_e18,(SpecConstant *)local_e50);
    local_720 = 8;
    local_718 = local_c40;
    local_e88 = (undefined1  [8])0x18;
    local_718 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_408,(ulong)local_e88);
    local_708 = (pointer *)local_e88;
    *local_718 = 0x20746e6920202020;
    ((pointer **)local_718)[1] = (pointer *)0x202020200a3b3072;
    ((pointer **)local_718)[2] = (pointer *)0xa3b317220746e69;
    local_710 = (pointer *)local_e88;
    *(char *)((long)local_718 + (long)local_e88) = '\0';
    local_6f8 = local_c48;
    local_6f0 = 0;
    local_6e8[0] = 0;
    local_6d8 = local_c50;
    local_e88 = (undefined1  [8])0x5d;
    local_6d8 = (pointer **)std::__cxx11::string::_M_create((ulong *)local_4e0,(ulong)local_e88);
    auVar1 = local_e88;
    local_6c8[0] = (pointer *)local_e88;
    memcpy(local_6d8,
           "    int a0[sc0];\n    int a1[sc1];\n\n    sb_out.r0 = a0.length();\n    sb_out.r1 = a1.length();\n"
           ,0x5d);
    local_6d0 = (pointer *)auVar1;
    *(undefined1 *)((long)local_6d8 + (long)auVar1) = 0;
    local_488.size = 4;
    local_488.offset = 0;
    local_488.value.m_data = 1;
    local_498.size = 4;
    local_498.offset = 4;
    local_498.value.m_data = 4;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_4e8,&local_488,&local_498);
    local_6a0 = 0;
    local_698 = local_4f0;
    local_e88 = (undefined1  [8])0x1b;
    local_698 = (ulong *)std::__cxx11::string::_M_create((ulong *)local_a78,(ulong)local_e88);
    local_688[0] = (ulong)local_e88;
    builtin_strncpy((char *)((long)local_698 + 0xb),"pass_to_",8);
    builtin_strncpy((char *)((long)local_698 + 0x13),"function",8);
    *local_698 = 0x69735f7961727261;
    local_698[1] = 0x5f737361705f657a;
    local_690 = (ulong)local_e88;
    *(char *)((long)local_698 + (long)local_e88) = '\0';
    local_de0 = local_dd0;
    local_ec0 = (undefined1  [8])0x2e;
    local_de0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_de0,(ulong)local_ec0);
    local_dd0[0] = (ulong)local_ec0;
    builtin_strncpy((char *)((long)local_de0 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_de0 + 0x26),"sc0 = 3;",8);
    local_de0[2] = 0x497b24203d206469;
    local_de0[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_de0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_de0 + 4),"ut(c",4);
    *(undefined4 *)(local_de0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_de0 + 0xc),"ant_",4);
    local_dd8 = (ulong)local_ec0;
    *(char *)((long)local_de0 + (long)local_ec0) = '\0';
    local_e88._0_4_ = 1;
    local_e80._M_p = (pointer)&local_e70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e80,local_de0,(char *)((long)local_de0 + (long)local_ec0));
    local_e60 = 0;
    local_e58.m_data = 0;
    local_ca0 = local_c90;
    local_bc8.size = 0x2e;
    local_bc8.offset = 0;
    local_ca0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_ca0,(ulong)&local_bc8);
    local_c90[0]._0_4_ = local_bc8.size;
    local_c90[0]._4_4_ = local_bc8.offset;
    builtin_strncpy((char *)((long)local_ca0 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_ca0 + 0x26),"sc1 = 1;",8);
    local_ca0[2] = 0x497b24203d206469;
    local_ca0[3] = 0x736e6f6320297d44;
    *(undefined4 *)local_ca0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_ca0 + 4),"ut(c",4);
    *(undefined4 *)(local_ca0 + 1) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_ca0 + 0xc),"ant_",4);
    local_c98._0_4_ = local_bc8.size;
    local_c98._4_4_ = local_bc8.offset;
    *(char *)((long)local_ca0 + local_bc8._0_8_) = '\0';
    local_ec0._0_4_ = 2;
    local_eb8._M_p = (pointer)&local_ea8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_eb8,local_ca0,(char *)((long)local_ca0 + local_bc8._0_8_));
    local_e98 = 4;
    local_e90.m_data = 3;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              (local_4f8,(SpecConstant *)local_e88,(SpecConstant *)local_ec0);
    local_660 = 4;
    local_658 = local_500;
    local_bc8.size = 0x10;
    local_bc8.offset = 0;
    local_658 = (long *)std::__cxx11::string::_M_create((ulong *)local_390,(ulong)&local_bc8);
    local_648[0]._0_4_ = local_bc8.size;
    local_648[0]._4_4_ = local_bc8.offset;
    *local_658 = 0x20746e6920202020;
    local_658[1] = 0xa3b746c75736572;
    local_650._0_4_ = local_bc8.size;
    local_650._4_4_ = local_bc8.offset;
    *(char *)((long)local_658 + local_bc8._0_8_) = '\0';
    local_638 = local_508;
    local_bc8.size = 0x9d;
    local_bc8.offset = 0;
    local_638 = (long *)std::__cxx11::string::_M_create((ulong *)local_398,(ulong)&local_bc8);
    uVar2 = local_bc8._0_8_;
    local_628[0]._0_4_ = local_bc8.size;
    local_628[0]._4_4_ = local_bc8.offset;
    memcpy(local_638,
           "int sumArrays (int a0[sc0], int a1[sc1])\n{\n    int sum = 0;\n    for (int i = 0; (i < sc0) && (i < sc1); ++i)\n        sum += a0[i] + a1[i];\n    return sum;\n}\n"
           ,0x9d);
    local_bc8.size = (deUint32)uVar2;
    local_bc8.offset = SUB84(uVar2,4);
    local_630._0_4_ = local_bc8.size;
    local_630._4_4_ = local_bc8.offset;
    *(undefined1 *)((long)local_638 + uVar2) = 0;
    local_618 = local_510;
    local_bc8.size = 0xbd;
    local_bc8.offset = 0;
    local_618 = (long *)std::__cxx11::string::_M_create((ulong *)local_3a0,(ulong)&local_bc8);
    uVar2 = local_bc8._0_8_;
    local_608[0]._0_4_ = local_bc8.size;
    local_608[0]._4_4_ = local_bc8.offset;
    memcpy(local_618,
           "    int a0[sc0];\n    int a1[sc1];\n\n    for (int i = 0; i < sc0; ++i)\n        a0[i] = i + 1;\n    for (int i = 0; i < sc1; ++i)\n        a1[i] = i + 2;\n\n    sb_out.result = sumArrays(a0, a1);\n"
           ,0xbd);
    local_bc8.size = (deUint32)uVar2;
    local_bc8.offset = SUB84(uVar2,4);
    local_610._0_4_ = local_bc8.size;
    local_610._4_4_ = local_bc8.offset;
    *(undefined1 *)((long)local_618 + uVar2) = 0;
    local_bc8.size = 4;
    local_bc8.offset = 0;
    local_bc8.value.m_data = 0xf;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>(local_3a8,&local_bc8);
    local_5e0 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_eb8._M_p != &local_ea8) {
      operator_delete(local_eb8._M_p,local_ea8._M_allocated_capacity + 1);
    }
    if (local_ca0 != local_c90) {
      operator_delete(local_ca0,local_c90[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e80._M_p != &local_e70) {
      operator_delete(local_e80._M_p,local_e70._M_allocated_capacity + 1);
    }
    if (local_de0 != local_dd0) {
      operator_delete(local_de0,local_dd0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e48._M_p != &local_e38) {
      operator_delete(local_e48._M_p,local_e38._M_allocated_capacity + 1);
    }
    if (local_c80 != local_c70) {
      operator_delete(local_c80,local_c70[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e10._M_p != &local_e00) {
      operator_delete(local_e10._M_p,local_e00._M_allocated_capacity + 1);
    }
    if ((pointer *)local_fb0._0_8_ != local_fa0) {
      operator_delete((void *)local_fb0._0_8_,(ulong)(local_fa0[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_db8._M_p != &local_da8) {
      operator_delete(local_db8._M_p,local_da8._M_allocated_capacity + 1);
    }
    if ((pointer *)local_cf8._0_8_ != local_ce8) {
      operator_delete((void *)local_cf8._0_8_,(ulong)(local_ce8[0] + 1));
    }
    if (local_d60._M_p != local_d58 + 8) {
      operator_delete(local_d60._M_p,local_d58._8_8_ + 1);
    }
    if ((pointer *)local_f58._0_8_ != local_f48) {
      operator_delete((void *)local_f58._0_8_,(ulong)(local_f48[0] + 1));
    }
    if (local_ef0._M_p != local_ee8 + 8) {
      operator_delete(local_ef0._M_p,local_ee8._8_8_ + 1);
    }
    if ((pointer *)local_f38._0_8_ != local_f28) {
      operator_delete((void *)local_f38._0_8_,(ulong)(local_f28[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f88._M_p != &local_f78) {
      operator_delete(local_f88._M_p,local_f78._M_allocated_capacity + 1);
    }
    if ((pointer *)local_f18._0_8_ != local_f08) {
      operator_delete((void *)local_f18._0_8_,(ulong)(local_f08[0] + 1));
    }
    if (local_1008._M_p != local_1000 + 8) {
      operator_delete(local_1008._M_p,local_1000._8_8_ + 1);
    }
    if ((pointer *)local_d88._0_8_ != local_d78) {
      operator_delete((void *)local_d88._0_8_,(ulong)(local_d78[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1068._M_p != &local_1058) {
      operator_delete(local_1068._M_p,local_1058._M_allocated_capacity + 1);
    }
    if ((pointer *)local_fd0._0_8_ != local_fc0) {
      operator_delete((void *)local_fd0._0_8_,(ulong)(local_fc0[0] + 1));
    }
    if (local_b38._M_p != local_b28) {
      operator_delete(local_b38._M_p,local_b28._0_8_ + 1);
    }
    if (local_1038 != local_1028) {
      operator_delete(local_1038,(long)local_1028[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    if (local_d30 != (undefined1  [8])&local_d20) {
      operator_delete((void *)local_d30,(ulong)(local_d20 + 1));
    }
    lVar16 = 0;
    do {
      pSVar7 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar7,local_1080,local_1074,(CaseDefinition *)(local_a58 + lVar16));
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      lVar16 = lVar16 + 0xc0;
    } while (lVar16 != 0x480);
    lVar16 = 0x3c0;
    do {
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_a58 + lVar16));
      lVar16 = lVar16 + -0xc0;
    } while (lVar16 != -0xc0);
    tcu::TestNode::addChild(local_c60,pTVar6);
    local_b60 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_b60,local_1080,"composite",
               "specialization constants usage in composite types");
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,local_1080,"vector","");
    lVar16 = 0;
    do {
      pSVar7 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::makeMatrixVectorCompositeCaseDefinition
                ((CaseDefinition *)local_a58,*(DataType *)((long)&DAT_00ab4df0 + lVar16));
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar7,local_1080,local_1074,(CaseDefinition *)local_a58);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_a58);
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x3c);
    tcu::TestNode::addChild(local_b60,pTVar6);
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,local_1080,"matrix","");
    lVar16 = 0;
    do {
      pSVar7 = (SpecConstantTest *)operator_new(0x138);
      anon_unknown_0::makeMatrixVectorCompositeCaseDefinition
                ((CaseDefinition *)local_a58,*(DataType *)((long)&DAT_00ab4e30 + lVar16));
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (pSVar7,local_1080,local_1074,(CaseDefinition *)local_a58);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_a58);
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x48);
    tcu::TestNode::addChild(local_b60,pTVar6);
    pTVar6 = (TestNode *)operator_new(0x70);
    pCVar13 = (CaseDefinition *)0xa99b87;
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,local_1080,"array","");
    lVar16 = 0;
    do {
      iVar12 = (int)pCVar13;
      pSVar7 = (SpecConstantTest *)operator_new(0x138);
      pCVar13 = (CaseDefinition *)local_a58;
      anon_unknown_0::makeArrayCompositeCaseDefinition
                (pCVar13,*(DataType *)((long)&DAT_00ab4e80 + lVar16),0,iVar12);
      anon_unknown_0::SpecConstantTest::SpecConstantTest(pSVar7,local_1080,local_1074,pCVar13);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_a58);
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x98);
    lVar16 = 0;
    do {
      iVar12 = (int)pCVar13;
      pSVar7 = (SpecConstantTest *)operator_new(0x138);
      pCVar13 = (CaseDefinition *)local_a58;
      anon_unknown_0::makeArrayCompositeCaseDefinition
                (pCVar13,*(DataType *)((long)&DAT_00ab4e80 + lVar16),2,iVar12);
      anon_unknown_0::SpecConstantTest::SpecConstantTest(pSVar7,local_1080,local_1074,pCVar13);
      tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_a58);
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0x98);
    local_a58._0_8_ = local_a58 + 0x10;
    local_a58._8_8_ = 6;
    local_a58._16_7_ = 0x746375727473;
    local_dc0 = (undefined1  [8])&local_db0;
    local_b40 = (undefined1  [8])&DAT_00000030;
    local_dc0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_dc0,(ulong)local_b40);
    local_db0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b40;
    *(undefined8 *)((long)local_dc0 + 0x20) = 0x202020746e692074;
    *(undefined8 *)((long)local_dc0 + 0x28) = 0x3b31203d20306373;
    *(undefined8 *)((long)local_dc0 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_dc0 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_dc0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_dc0 + 4),"ut(c",4);
    *(undefined4 *)((long)local_dc0 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_dc0 + 0xc),"ant_",4);
    local_db8._M_p = (pointer)local_b40;
    *(char *)((long)local_dc0 + (long)local_b40) = '\0';
    local_350._0_4_ = 1;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_dc0,(char *)((long)local_b40 + (long)local_dc0));
    local_328 = 4;
    local_320.m_data = 3;
    local_e18 = (undefined1  [8])&local_e08;
    local_1070 = (undefined1  [8])0x32;
    local_e18 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_e18,(ulong)local_1070);
    local_e08 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1070;
    *(undefined8 *)((long)local_e18 + 0x20) = 0x2074616f6c662074;
    *(undefined8 *)((long)local_e18 + 0x28) = 0x2e31203d20316373;
    *(undefined8 *)((long)local_e18 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_e18 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_e18 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_e18 + 4),"ut(c",4);
    *(undefined4 *)((long)local_e18 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_e18 + 0xc),"ant_",4);
    *(undefined2 *)((long)local_e18 + 0x30) = 0x3b30;
    local_e10._M_p = (pointer)local_1070;
    *(char *)((long)local_e18 + (long)local_1070) = '\0';
    local_b40._0_4_ = 2;
    local_b38._M_p = local_b28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b38,local_e18,(char *)((long)local_1070 + (long)local_e18));
    local_b18 = 4;
    local_b10.m_data = 0x40a00000;
    local_e50 = (undefined1  [8])&local_e40;
    local_1010 = (undefined1  [8])&DAT_00000033;
    local_e50 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_e50,(ulong)local_1010);
    local_e40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1010;
    *(undefined8 *)((long)local_e50 + 0x20) = 0x20206c6f6f622074;
    *(undefined8 *)((long)local_e50 + 0x28) = 0x7274203d20326373;
    *(undefined8 *)((long)local_e50 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_e50 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_e50 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_e50 + 4),"ut(c",4);
    *(undefined4 *)((long)local_e50 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_e50 + 0xc),"ant_",4);
    builtin_strncpy((char *)((long)local_e50 + 0x2f),"rue;",4);
    local_e48._M_p = (pointer)local_1010;
    *(char *)((long)local_e50 + (long)local_1010) = '\0';
    local_1070._0_4_ = 3;
    local_1068._M_p = (pointer)&local_1058;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1068,local_e50,(char *)((long)local_1010 + (long)local_e50));
    local_1048 = 4;
    local_1040.m_data = 0;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_a58 + 0x20),(SpecConstant *)local_350,(SpecConstant *)local_b40,
               (SpecConstant *)local_1070);
    local_a58._56_8_ = 4;
    local_a18._M_p = (pointer)&local_a08;
    local_1010 = (undefined1  [8])&DAT_00000010;
    local_a18._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_a18,(ulong)local_1010)
    ;
    local_a08._M_allocated_capacity._0_5_ = local_1010._0_5_;
    local_a08._M_allocated_capacity._5_3_ = local_1010._5_3_;
    builtin_strncpy(local_a18._M_p,"    int result;\n",0x10);
    local_a10 = (pointer)local_1010;
    local_a18._M_p[(long)local_1010] = '\0';
    local_9f8._M_p = (pointer)&local_9e8;
    local_1010 = (undefined1  [8])0x8c;
    local_9f8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_9f8,(ulong)local_1010)
    ;
    auVar1 = local_1010;
    local_9e8._M_allocated_capacity = (size_type)local_1010;
    memcpy(local_9f8._M_p,
           "struct Data {\n    int   x;\n    float y;\n    bool  z;\n};\n\nData a0[3] = Data[3](Data(sc0, 2.0, true), Data(1, sc1, true), Data(1, 2.0, sc2));\n"
           ,0x8c);
    local_9f0 = (pointer)auVar1;
    local_9f8._M_p[(long)auVar1] = '\0';
    local_9d8._M_p = (pointer)local_1018;
    local_1010 = (undefined1  [8])0x90;
    local_9d8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_bd0,(ulong)local_1010);
    auVar1 = local_1010;
    local_9c8._M_allocated_capacity = (size_type)local_1010;
    memcpy(local_9d8._M_p,
           "    int sum_a0 = 0;\n\n    for (int i = 0; i < 3; ++i)\n        sum_a0 += int(a0[i].x) + int(a0[i].y) + int(a0[i].z);\n\n    sb_out.result = sum_a0;\n"
           ,0x90);
    local_9d0 = (pointer)auVar1;
    local_9d8._M_p[(long)auVar1] = '\0';
    local_1010 = (undefined1  [8])0x4;
    local_1008._M_p = &DAT_00000010;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_bd8,(OffsetValue *)local_1010);
    local_9a0 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1068._M_p != &local_1058) {
      operator_delete(local_1068._M_p,local_1058._M_allocated_capacity + 1);
    }
    if (local_e50 != (undefined1  [8])&local_e40) {
      operator_delete((void *)local_e50,(ulong)(local_e40->_M_local_buf + 1));
    }
    if (local_b38._M_p != local_b28) {
      operator_delete(local_b38._M_p,local_b28._0_8_ + 1);
    }
    if (local_e18 != (undefined1  [8])&local_e08) {
      operator_delete((void *)local_e18,(ulong)(local_e08->_M_local_buf + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    if (local_dc0 != (undefined1  [8])&local_db0) {
      operator_delete((void *)local_dc0,(ulong)(local_db0->_M_local_buf + 1));
    }
    pSVar7 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest
              (pSVar7,local_1080,local_1074,(CaseDefinition *)local_a58);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
    anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_a58);
    tcu::TestNode::addChild(local_b60,pTVar6);
    local_b58 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_b58,local_1080,"struct","");
    local_3e8 = 0;
    do {
      local_388 = (SpecConstantTest *)operator_new(0x138);
      DVar5 = *(DataType *)((long)&DAT_00ab4e80 + local_3e8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a58);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"struct Data {\n",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"    int   i;\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"    float f;\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"    bool  b;\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"    ",4);
      pcVar8 = glu::getDataTypeName(DVar5);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)local_1088 + (int)*(undefined8 *)(local_a58._0_8_ + -0x18) + 0x630);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58," sc;\n",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"    uint  ui;\n",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"};\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a58,"Data s0 = Data(3, 2.0, true, ",0x1d);
      pcVar8 = glu::getDataTypeName(DVar5);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)local_1088 + (int)*(undefined8 *)(local_a58._0_8_ + -0x18) + 0x630);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_a58,"(sc0), 8u);\n",0xc);
      specConstId = glu::getDataTypeScalarType(DVar5);
      type = TYPE_DOUBLE_MAT3X4;
      if (specConstId == TYPE_BOOL) {
        type = TYPE_INVALID;
      }
      DVar4 = specConstId;
      if (specConstId == TYPE_BOOL) {
        DVar4 = TYPE_INT;
      }
      pcVar8 = glu::getDataTypeName(DVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1010,pcVar8,(allocator<char> *)local_350);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_350);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350,"    ",4);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_350,(char *)local_1010,(long)local_1008._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," sum_s0 = ",10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_1010,(long)local_1008._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(0);\n",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    sum_s0 += ",0xe);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_1010,(long)local_1008._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(s0.i);\n",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    sum_s0 += ",0xe);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_1010,(long)local_1008._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(s0.f);\n",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    sum_s0 += ",0xe);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_1010,(long)local_1008._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(s0.b);\n",8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    sum_s0 += ",0xe);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_1010,(long)local_1008._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(s0.sc",6);
      pcVar8 = "[0][0]";
      if ((8 < DVar5 - TYPE_DOUBLE_MAT2 && 8 < DVar5 - TYPE_FLOAT_MAT2) &&
         (((DVar5 < TYPE_BOOL && ((0x77003801cU >> ((ulong)DVar5 & 0x3f) & 1) != 0)) ||
          (pcVar8 = "", DVar5 - TYPE_BOOL_VEC2 < 3)))) {
        pcVar8 = "[0]";
      }
      local_1070 = (undefined1  [8])&local_1060;
      sVar9 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1070,pcVar8,pcVar8 + sVar9);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_1070,(long)local_1068._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,");\n",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"    sum_s0 += ",0xe);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_1010,(long)local_1008._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(s0.ui);\n",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"    sb_out.result = sum_s0;\n",0x1c);
      if (local_1070 != (undefined1  [8])&local_1060) {
        operator_delete((void *)local_1070,(ulong)(local_1060 + 1));
      }
      pcVar8 = glu::getDataTypeName(DVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f90,pcVar8,(allocator<char> *)local_1070);
      local_b40 = (undefined1  [8])local_b30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b40,local_f90,local_f88._M_p + (long)local_f90);
      local_ef8 = (undefined1  [8])local_ee8;
      local_ee8[2] = '0';
      local_ee8._0_2_ = 0x6373;
      local_ef0._M_p = (pointer)0x3;
      local_ee8[3] = '\0';
      anon_unknown_0::composite_case_internal::makeSpecConstant
                ((SpecConstant *)local_1070,(string *)local_ef8,specConstId,type,(int)o4);
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                  *)(local_b28 + 8),(SpecConstant *)local_1070);
      DVar4 = glu::getDataTypeScalarType(DVar4);
      if (DVar4 < TYPE_BOOL_VEC2) {
        local_b08 = 4;
        if ((0x888000002U >> ((ulong)DVar4 & 0x3f) & 1) == 0) {
          if ((ulong)DVar4 != 0xe) goto LAB_0049009b;
          local_b08 = 8;
        }
      }
      else {
LAB_0049009b:
        local_b08 = 0;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d68,
                     "    ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1010);
      plVar11 = (long *)std::__cxx11::string::append((char *)local_d68);
      local_b00._M_p = (pointer)local_af0;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar14) {
        local_af0[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_af0[0]._8_8_ = plVar11[3];
      }
      else {
        local_af0[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_b00._M_p = (pointer)*plVar11;
      }
      local_af8 = plVar11[1];
      *plVar11 = (long)paVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      DVar5 = glu::getDataTypeScalarType(DVar5);
      if (DVar5 < TYPE_BOOL_VEC2) {
        local_d30._0_4_ = 4;
        if ((0x888000002U >> ((ulong)DVar5 & 0x3f) & 1) == 0) {
          if ((ulong)DVar5 != 0xe) goto LAB_004900a2;
          local_d30._0_4_ = 8;
        }
      }
      else {
LAB_004900a2:
        local_d30._0_4_ = 0;
      }
      uVar15 = type + TYPE_DOUBLE;
      if (specConstId == TYPE_FLOAT) {
        local_d28._M_p = (pointer)(ulong)(uint)(float)uVar15;
      }
      else if (specConstId == TYPE_DOUBLE) {
        local_d28._M_p = (pointer)(double)uVar15;
      }
      else {
        local_d28._M_p = (pointer)(ulong)uVar15;
      }
      local_d30._4_4_ = 0;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_1c8,(OffsetValue *)local_d30);
      local_a88 = (uint)(specConstId == TYPE_DOUBLE) << 2;
      if (local_d68 != (undefined1  [8])local_d58) {
        operator_delete((void *)local_d68,local_d58._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1068._M_p != &local_1058) {
        operator_delete(local_1068._M_p,local_1058._M_allocated_capacity + 1);
      }
      if (local_ef8 != (undefined1  [8])local_ee8) {
        operator_delete((void *)local_ef8,
                        CONCAT44(local_ee8._4_4_,
                                 CONCAT13(local_ee8[3],CONCAT12(local_ee8[2],local_ee8._0_2_))) + 1)
        ;
      }
      if (local_f90 != (undefined1  [8])&local_f80) {
        operator_delete((void *)local_f90,local_f80 + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_350);
      std::ios_base::~ios_base(local_2e0);
      if (local_1010 != (undefined1  [8])local_1000) {
        operator_delete((void *)local_1010,(ulong)(local_1000._0_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a58);
      std::ios_base::~ios_base((ios_base *)local_9e8._M_local_buf);
      pSVar7 = local_388;
      anon_unknown_0::SpecConstantTest::SpecConstantTest
                (local_388,local_1080,local_1074,(CaseDefinition *)local_b40);
      tcu::TestNode::addChild(local_b58,(TestNode *)pSVar7);
      anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_b40);
      local_3e8 = local_3e8 + 4;
    } while (local_3e8 != 0x98);
    local_a58._0_8_ = local_a58 + 0x10;
    local_a58._8_8_ = 5;
    local_a58._16_6_ = 0x7961727261;
    local_e88 = (undefined1  [8])&local_e78;
    local_b40 = (undefined1  [8])0x32;
    local_e88 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_e88,(ulong)local_b40);
    local_e78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b40;
    *(undefined8 *)((long)local_e88 + 0x20) = 0x2074616f6c662074;
    *(undefined8 *)((long)local_e88 + 0x28) = 0x2e31203d20306373;
    *(undefined8 *)((long)local_e88 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_e88 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_e88 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_e88 + 4),"ut(c",4);
    *(undefined4 *)((long)local_e88 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_e88 + 0xc),"ant_",4);
    *(undefined2 *)((long)local_e88 + 0x30) = 0x3b30;
    local_e80._M_p = (pointer)local_b40;
    *(char *)((long)local_e88 + (long)local_b40) = '\0';
    local_350._0_4_ = 1;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_e88,(char *)((long)local_b40 + (long)local_e88));
    local_328 = 4;
    local_320.m_data = 0x41f80000;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_a58 + 0x20),(SpecConstant *)local_350);
    local_a58._56_8_ = 4;
    local_a18._M_p = (pointer)&local_a08;
    local_b40 = (undefined1  [8])0x12;
    local_a18._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_a18,(ulong)local_b40);
    local_a08._M_allocated_capacity._0_5_ = local_b40._0_5_;
    local_a08._M_allocated_capacity._5_3_ = local_b40._5_3_;
    builtin_strncpy(local_a18._M_p,"    float result;\n",0x12);
    local_a10 = (pointer)local_b40;
    local_a18._M_p[(long)local_b40] = '\0';
    local_9f8._M_p = (pointer)&local_9e8;
    local_b40 = (undefined1  [8])0x7e;
    local_9f8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_9f8,(ulong)local_b40);
    auVar1 = local_b40;
    local_9e8._M_allocated_capacity = (size_type)local_b40;
    memcpy(local_9f8._M_p,
           "struct Data {\n    int  i;\n    vec3 sc[3];\n    bool b;\n};\n\nData s0 = Data(1, vec3[3](vec3(2.0), vec3(sc0), vec3(4.0)), false);\n"
           ,0x7e);
    local_9f0 = (pointer)auVar1;
    local_9f8._M_p[(long)auVar1] = '\0';
    local_9d8._M_p = (pointer)local_1018;
    local_b40 = (undefined1  [8])0xd0;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)local_bd0,(ulong)local_b40);
    auVar1 = local_b40;
    local_9c8._M_allocated_capacity = (size_type)local_b40;
    local_9d8._M_p = __dest;
    memcpy(__dest,
           "    float sum_s0 = 0;\n\n    sum_s0 += float(s0.i);\n    sum_s0 += float(s0.sc[0][0]);\n    sum_s0 += float(s0.sc[1][0]);\n    sum_s0 += float(s0.sc[2][0]);\n    sum_s0 += float(s0.b);\n\n    sb_out.result = sum_s0;\n"
           ,0xd0);
    local_9d0 = (pointer)auVar1;
    __dest[(long)auVar1] = '\0';
    local_b40 = (undefined1  [8])0x4;
    local_b38._M_p = (pointer)0x42180000;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_bd8,(OffsetValue *)local_b40);
    local_9a0 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    if (local_e88 != (undefined1  [8])&local_e78) {
      operator_delete((void *)local_e88,(ulong)(local_e78->_M_local_buf + 1));
    }
    pSVar7 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest
              (pSVar7,local_1080,local_1074,(CaseDefinition *)local_a58);
    tcu::TestNode::addChild(local_b58,(TestNode *)pSVar7);
    anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_a58);
    local_a58._0_8_ = local_a58 + 0x10;
    local_a58._8_8_ = 6;
    local_a58._16_7_ = 0x746375727473;
    local_ec0 = (undefined1  [8])&local_eb0;
    local_b40 = (undefined1  [8])0x2e;
    local_ec0 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)local_ec0,(ulong)local_b40);
    local_eb0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b40;
    builtin_strncpy((char *)((long)local_ec0 + 0x1e),"nst int ",8);
    builtin_strncpy((char *)((long)local_ec0 + 0x26),"sc0 = 1;",8);
    *(undefined8 *)((long)local_ec0 + 0x10) = 0x497b24203d206469;
    *(undefined8 *)((long)local_ec0 + 0x18) = 0x736e6f6320297d44;
    *(undefined4 *)local_ec0 = 0x6f79616c;
    builtin_strncpy((char *)((long)local_ec0 + 4),"ut(c",4);
    *(undefined4 *)((long)local_ec0 + 8) = 0x74736e6f;
    builtin_strncpy((char *)((long)local_ec0 + 0xc),"ant_",4);
    local_eb8._M_p = (pointer)local_b40;
    *(char *)((long)local_ec0 + (long)local_b40) = '\0';
    local_350._0_4_ = 1;
    local_348._M_p = (pointer)&local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_ec0,(char *)((long)local_b40 + (long)local_ec0));
    local_328 = 4;
    local_320.m_data = 0xb;
    makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
              ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                *)(local_a58 + 0x20),(SpecConstant *)local_350);
    local_a58._56_8_ = 4;
    local_a18._M_p = (pointer)&local_a08;
    local_b40 = (undefined1  [8])&DAT_00000010;
    local_a18._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_a18,(ulong)local_b40);
    local_a08._M_allocated_capacity._0_5_ = local_b40._0_5_;
    local_a08._M_allocated_capacity._5_3_ = local_b40._5_3_;
    *(undefined8 *)local_a18._M_p = 0x20746e6920202020;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_p + 8) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_p + 9) = 'e';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_p + 10) = 's';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_p + 0xb) = 'u';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_p + 0xc) = 'l';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_p + 0xd) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_p + 0xe) = ';';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a18._M_p + 0xf) = '\n';
    local_a10 = (pointer)local_b40;
    local_a18._M_p[(long)local_b40] = '\0';
    local_9f8._M_p = (pointer)&local_9e8;
    local_b40 = (undefined1  [8])0xb0;
    local_9f8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)&local_9f8,(ulong)local_b40);
    auVar1 = local_b40;
    local_9e8._M_allocated_capacity = (size_type)local_b40;
    memcpy(local_9f8._M_p,
           "struct Nested {\n    vec2  v;\n    int   sc;\n    float f;\n};\n\nstruct Data {\n    uint   ui;\n    Nested s;\n    bool   b;\n};\n\nData s0 = Data(1u, Nested(vec2(2.0), sc0, 4.0), true);\n"
           ,0xb0);
    local_9f0 = (pointer)auVar1;
    local_9f8._M_p[(long)auVar1] = '\0';
    local_9d8._M_p = (pointer)local_1018;
    local_b40 = (undefined1  [8])0xba;
    local_9d8._M_p = (pointer)std::__cxx11::string::_M_create((ulong *)local_bd0,(ulong)local_b40);
    auVar1 = local_b40;
    local_9c8._M_allocated_capacity = (size_type)local_b40;
    memcpy(local_9d8._M_p,
           "    int sum_s0 = 0;\n\n    sum_s0 += int(s0.ui);\n    sum_s0 += int(s0.s.v[0]);\n    sum_s0 += int(s0.s.sc);\n    sum_s0 += int(s0.s.f);\n    sum_s0 += int(s0.b);\n\n    sb_out.result = sum_s0;\n"
           ,0xba);
    local_9d0 = (pointer)auVar1;
    local_9d8._M_p[(long)auVar1] = '\0';
    local_b40 = (undefined1  [8])0x4;
    local_b38._M_p = (pointer)0x13;
    makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
              (local_bd8,(OffsetValue *)local_b40);
    local_9a0 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_p != &local_338) {
      operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
    }
    if (local_ec0 != (undefined1  [8])&local_eb0) {
      operator_delete((void *)local_ec0,(ulong)(local_eb0->_M_local_buf + 1));
    }
    pSVar7 = (SpecConstantTest *)operator_new(0x138);
    anon_unknown_0::SpecConstantTest::SpecConstantTest
              (pSVar7,local_1080,local_1074,(CaseDefinition *)local_a58);
    tcu::TestNode::addChild(local_b58,(TestNode *)pSVar7);
    anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)local_a58);
    pTVar6 = local_b60;
    tcu::TestNode::addChild(local_b60,local_b58);
    tcu::TestNode::addChild(local_c60,pTVar6);
    if (*(int *)(local_3f0 + 2) == 0x20) {
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,local_1080,"local_size","work group size specialization");
      local_d30 = (undefined1  [8])&local_d20;
      local_a58._0_8_ = (pointer)0x2d;
      local_d30 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_d30,(ulong)local_a58);
      local_d20 = (pointer)local_a58._0_8_;
      builtin_strncpy((char *)((long)local_d30 + 0x1d),"uint  ch",8);
      builtin_strncpy((char *)((long)local_d30 + 0x25),"ecksum;\n",8);
      *(undefined8 *)((long)local_d30 + 0x10) = 0x3b657a695370756f;
      *(undefined8 *)((long)local_d30 + 0x18) = 0x6e6975202020200a;
      *(undefined8 *)local_d30 = 0x6365767520202020;
      *(undefined8 *)((long)local_d30 + 8) = 0x72476b726f772033;
      local_d28._M_p = (pointer)local_a58._0_8_;
      *(char *)((long)local_d30 + local_a58._0_8_) = '\0';
      local_1038 = local_1028;
      local_a58._0_8_ = (pointer *)0x13;
      local_1038 = (pointer **)
                   std::__cxx11::string::_M_create((ulong *)&local_1038,(ulong)local_a58);
      local_1028[0] = (pointer *)local_a58._0_8_;
      *local_1038 = (pointer *)0x7520646572616873;
      local_1038[1] = (pointer *)0x6e756f6320746e69;
      builtin_strncpy((char *)((long)local_1038 + 0xf),"nt;\n",4);
      local_1030 = (pointer *)local_a58._0_8_;
      *(char *)((long)local_1038 + local_a58._0_8_) = '\0';
      local_fd0._0_8_ = local_fc0;
      local_a58._0_8_ = (pointer)0xcf;
      __dest_00 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_fd0,(ulong)local_a58);
      uVar2 = local_a58._0_8_;
      local_fc0[0] = (pointer)local_a58._0_8_;
      local_fd0._0_8_ = __dest_00;
      memcpy(__dest_00,
             "    count = 0u;\n\n    groupMemoryBarrier();\n    barrier();\n\n    atomicAdd(count, 1u);\n\n    groupMemoryBarrier();\n    barrier();\n\n    sb_out.workGroupSize = gl_WorkGroupSize;\n    sb_out.checksum      = count;\n"
             ,0xcf);
      local_fd0.value.m_data = uVar2;
      *(char *)((long)__dest_00 + uVar2) = '\0';
      local_a58._0_8_ = local_a58 + 0x10;
      local_a58._16_2_ = 0x78;
      local_a58._8_8_ = 1;
      local_d88._0_8_ = local_d78;
      local_b40 = (undefined1  [8])0x23;
      local_d88._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_d88,(ulong)local_b40);
      local_d78[0] = (pointer)local_b40;
      *(undefined8 *)(local_d88._0_8_ + 0x10) = 0x3d2064695f785f65;
      *(undefined8 *)(local_d88._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_d88._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_d88._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_d88._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_d88._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_d88._0_8_ + 0x1f)," in;",4);
      local_d88.value.m_data = (deUint64)local_b40;
      *(char *)(local_d88._0_8_ + (long)local_b40) = '\0';
      local_350._0_4_ = 1;
      local_348._M_p = (pointer)&local_338;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,local_d88._0_8_,(pointer)((long)local_b40 + local_d88._0_8_));
      local_328 = 4;
      local_320.m_data = 7;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                ((vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
                  *)(local_a58 + 0x20),(SpecConstant *)local_350);
      local_a58._56_8_ = 0x10;
      local_a18._M_p = (pointer)&local_a08;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a18,local_d30,local_d28._M_p + (long)local_d30);
      local_9f8._M_p = (pointer)&local_9e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_9f8,local_1038,(char *)((long)local_1030 + (long)local_1038));
      local_9d8._M_p = (pointer)local_1018;
      std::__cxx11::string::_M_construct<char*>
                (local_bd0,local_fd0._0_8_,(char *)(local_fd0._0_8_ + local_fd0.value.m_data));
      local_428.size = 4;
      local_428.offset = 0;
      local_428.value.m_data = 7;
      local_438.size = 4;
      local_438.offset = 4;
      local_438.value.m_data = 1;
      local_448.size = 4;
      local_448.offset = 8;
      local_448.value.m_data = 1;
      local_458.size = 4;
      local_458.offset = 0xc;
      local_458.value.m_data = 7;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_bd8,&local_428,&local_438,&local_448,&local_458);
      local_9a0 = 0;
      local_998._0_8_ = local_ca8;
      local_998._16_2_ = 0x79;
      local_998._8_8_ = 1;
      local_f18._0_8_ = local_f08;
      local_1070 = (undefined1  [8])0x23;
      local_f18._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f18,(ulong)local_1070);
      local_f08[0] = (pointer)local_1070;
      *(undefined8 *)(local_f18._0_8_ + 0x10) = 0x3d2064695f795f65;
      *(undefined8 *)(local_f18._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_f18._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_f18._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_f18._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_f18._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_f18._0_8_ + 0x1f)," in;",4);
      local_f18.value.m_data = (deUint64)local_1070;
      *(char *)(local_f18._0_8_ + (long)local_1070) = '\0';
      local_b40._0_4_ = 1;
      local_b38._M_p = local_b28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b38,local_f18._0_8_,(pointer)((long)local_1070 + local_f18._0_8_))
      ;
      local_b18 = 4;
      local_b10.m_data = 5;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_cb0,(SpecConstant *)local_b40);
      local_998._56_8_ = 0x10;
      local_958._M_p = (pointer)local_cb8;
      std::__cxx11::string::_M_construct<char*>
                (local_a60,local_d30,local_d28._M_p + (long)local_d30);
      local_938._M_p = (pointer)local_cc0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_938,local_1038,(char *)((long)local_1030 + (long)local_1038));
      local_918._M_p = (pointer)local_cc8;
      std::__cxx11::string::_M_construct<char*>
                (local_a68,local_fd0._0_8_,(char *)(local_fd0._0_8_ + local_fd0.value.m_data));
      local_468.size = 4;
      local_468.offset = 0;
      local_468.value.m_data = 1;
      local_478.size = 4;
      local_478.offset = 4;
      local_478.value.m_data = 5;
      local_488.size = 4;
      local_488.offset = 8;
      local_488.value.m_data = 1;
      local_498.size = 4;
      local_498.offset = 0xc;
      local_498.value.m_data = 5;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_a70,&local_468,&local_478,&local_488,&local_498);
      local_8e0 = 0;
      local_8d8 = local_be0;
      local_8c8[0] = CONCAT62(local_8c8[0]._2_6_,0x7a);
      local_8d0 = 1;
      local_f38._0_8_ = local_f28;
      local_1010 = (undefined1  [8])0x23;
      local_f38._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f38,(ulong)local_1010);
      local_f28[0] = (pointer)local_1010;
      *(undefined8 *)(local_f38._0_8_ + 0x10) = 0x3d2064695f7a5f65;
      *(undefined8 *)(local_f38._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_f38._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_f38._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_f38._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_f38._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_f38._0_8_ + 0x1f)," in;",4);
      local_f38.value.m_data = (deUint64)local_1010;
      *(char *)(local_f38._0_8_ + (long)local_1010) = '\0';
      local_1070._0_4_ = 1;
      local_1068._M_p = (pointer)&local_1058;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1068,local_f38._0_8_,(pointer)((long)local_1010 + local_f38._0_8_)
                );
      local_1048 = 4;
      local_1040.m_data = 3;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_bf0,(SpecConstant *)local_1070);
      local_8a0 = 0x10;
      local_898 = local_bf8;
      std::__cxx11::string::_M_construct<char*>
                (local_3f8,local_d30,local_d28._M_p + (long)local_d30);
      local_878 = local_c00;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_878,local_1038,(char *)((long)local_1030 + (long)local_1038));
      local_858 = local_c08;
      std::__cxx11::string::_M_construct<char*>
                (local_4c0,local_fd0._0_8_,(char *)(local_fd0._0_8_ + local_fd0.value.m_data));
      local_bc8.size = 4;
      local_bc8.offset = 0;
      local_bc8.value.m_data = 1;
      local_360.size = 4;
      local_360.offset = 4;
      local_360.value.m_data = 1;
      local_b50.size = 4;
      local_b50.offset = 8;
      local_b50.value.m_data = 3;
      local_370.size = 4;
      local_370.offset = 0xc;
      local_370.value.m_data = 3;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_4c8,&local_bc8,&local_360,&local_b50,&local_370);
      local_820 = 0;
      local_818 = local_be8;
      local_810 = (pointer)0x2;
      local_808[0] = (pointer)CONCAT53(local_808[0]._3_5_,0x7978);
      local_f58._0_8_ = local_f48;
      local_f90 = (undefined1  [8])0x23;
      local_f58._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_f58,(ulong)local_f90);
      local_f48[0] = (pointer)local_f90;
      *(undefined8 *)(local_f58._0_8_ + 0x10) = 0x3d2064695f785f65;
      *(undefined8 *)(local_f58._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_f58._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_f58._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_f58._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_f58._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_f58._0_8_ + 0x1f)," in;",4);
      local_f58.value.m_data = (deUint64)local_f90;
      *(char *)(local_f58._0_8_ + (long)local_f90) = '\0';
      local_1010._0_4_ = 1;
      local_1008._M_p = local_1000 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1008,local_f58._0_8_,(char *)(local_f58._0_8_ + (long)local_f90));
      local_fe8 = 4;
      local_fe0.m_data = 6;
      local_cf8._0_8_ = local_ce8;
      local_ef8 = (undefined1  [8])0x23;
      local_cf8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_cf8,(ulong)local_ef8);
      local_ce8[0] = (pointer)local_ef8;
      *(undefined8 *)(local_cf8._0_8_ + 0x10) = 0x3d2064695f795f65;
      *(undefined8 *)(local_cf8._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_cf8._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_cf8._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_cf8._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_cf8._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_cf8._0_8_ + 0x1f)," in;",4);
      local_cf8.value.m_data = (deUint64)local_ef8;
      *(char *)(local_cf8._0_8_ + (long)local_ef8) = '\0';
      local_f90._0_4_ = 2;
      local_f88._M_p = (pointer)&local_f78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f88,local_cf8._0_8_,(pointer)((long)local_ef8 + local_cf8._0_8_));
      local_f68 = 4;
      local_f60.m_data = 4;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_c18,(SpecConstant *)local_1010,(SpecConstant *)local_f90);
      local_7e0 = 0x10;
      local_7d8 = local_c20;
      std::__cxx11::string::_M_construct<char*>
                (local_400,local_d30,local_d28._M_p + (long)local_d30);
      local_7b8 = local_c28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7b8,local_1038,(char *)((long)local_1030 + (long)local_1038));
      local_798 = local_c30;
      std::__cxx11::string::_M_construct<char*>
                (local_4d0,local_fd0._0_8_,(char *)(local_fd0._0_8_ + local_fd0.value.m_data));
      local_d8.size = 4;
      local_d8.offset = 0;
      local_d8.value.m_data = 6;
      local_e8.size = 4;
      local_e8.offset = 4;
      local_e8.value.m_data = 4;
      local_f8.size = 4;
      local_f8.offset = 8;
      local_f8.value.m_data = 1;
      local_108.size = 4;
      local_108.offset = 0xc;
      local_108.value.m_data = 0x18;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_4d8,&local_d8,&local_e8,&local_f8,&local_108);
      local_760 = 0;
      local_758 = local_c10;
      local_750 = 2;
      local_748[0] = CONCAT53(local_748[0]._3_5_,0x7a78);
      local_fb0._0_8_ = local_fa0;
      local_d68 = (undefined1  [8])0x23;
      local_fb0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_fb0,(ulong)local_d68);
      local_fa0[0] = (pointer)local_d68;
      *(undefined8 *)(local_fb0._0_8_ + 0x10) = 0x3d2064695f785f65;
      *(undefined8 *)(local_fb0._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_fb0._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_fb0._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_fb0._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_fb0._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_fb0._0_8_ + 0x1f)," in;",4);
      local_fb0.value.m_data = (deUint64)local_d68;
      *(char *)(local_fb0._0_8_ + (long)local_d68) = '\0';
      local_ef8._0_4_ = 1;
      local_ef0._M_p = local_ee8 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_ef0,local_fb0._0_8_,(pointer)((long)local_d68 + local_fb0._0_8_));
      local_ed0 = 4;
      local_ec8.m_data = 3;
      local_c80 = local_c70;
      local_dc0 = (undefined1  [8])0x23;
      local_c80 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_c80,(ulong)local_dc0);
      local_c70[0] = (ulong)local_dc0;
      local_c80[2] = 0x3d2064695f7a5f65;
      local_c80[3] = 0x20297d44497b2420;
      *(undefined4 *)local_c80 = 0x6f79616c;
      builtin_strncpy((char *)((long)local_c80 + 4),"ut(l",4);
      *(undefined4 *)(local_c80 + 1) = 0x6c61636f;
      builtin_strncpy((char *)((long)local_c80 + 0xc),"_siz",4);
      builtin_strncpy((char *)((long)local_c80 + 0x1f)," in;",4);
      local_c78 = (ulong)local_dc0;
      *(char *)((long)local_c80 + (long)local_dc0) = '\0';
      local_d68._0_4_ = 2;
      local_d60._M_p = local_d58 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d60,local_c80,(char *)((long)local_c80 + (long)local_dc0));
      local_d40 = 4;
      local_d38.m_data = 9;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_c38,(SpecConstant *)local_ef8,(SpecConstant *)local_d68);
      local_720 = 0x10;
      local_718 = local_c40;
      std::__cxx11::string::_M_construct<char*>
                (local_408,local_d30,local_d28._M_p + (long)local_d30);
      local_6f8 = local_c48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6f8,local_1038,(char *)((long)local_1030 + (long)local_1038));
      local_6d8 = local_c50;
      std::__cxx11::string::_M_construct<char*>
                (local_4e0,local_fd0._0_8_,(char *)(local_fd0._0_8_ + local_fd0.value.m_data));
      local_118.size = 4;
      local_118.offset = 0;
      local_118.value.m_data = 3;
      local_128.size = 4;
      local_128.offset = 4;
      local_128.value.m_data = 1;
      local_138.size = 4;
      local_138.offset = 8;
      local_138.value.m_data = 9;
      local_148.size = 4;
      local_148.offset = 0xc;
      local_148.value.m_data = 0x1b;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_4e8,&local_118,&local_128,&local_138,&local_148);
      local_6a0 = 0;
      local_698 = local_4f0;
      local_690 = 2;
      local_688[0] = CONCAT53(local_688[0]._3_5_,0x7a79);
      local_de0 = local_dd0;
      local_e18 = (undefined1  [8])0x23;
      local_de0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_de0,(ulong)local_e18);
      local_dd0[0] = (ulong)local_e18;
      local_de0[2] = 0x3d2064695f795f65;
      local_de0[3] = 0x20297d44497b2420;
      *(undefined4 *)local_de0 = 0x6f79616c;
      builtin_strncpy((char *)((long)local_de0 + 4),"ut(l",4);
      *(undefined4 *)(local_de0 + 1) = 0x6c61636f;
      builtin_strncpy((char *)((long)local_de0 + 0xc),"_siz",4);
      builtin_strncpy((char *)((long)local_de0 + 0x1f)," in;",4);
      local_dd8 = (ulong)local_e18;
      *(char *)((long)local_de0 + (long)local_e18) = '\0';
      local_dc0._0_4_ = 1;
      local_db8._M_p = (pointer)&local_da8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_db8,local_de0,(char *)((long)local_de0 + (long)local_e18));
      local_d98 = 4;
      local_d90.m_data = 2;
      local_ca0 = local_c90;
      local_e50 = (undefined1  [8])0x23;
      local_ca0 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_ca0,(ulong)local_e50);
      local_c90[0] = (ulong)local_e50;
      local_ca0[2] = 0x3d2064695f7a5f65;
      local_ca0[3] = 0x20297d44497b2420;
      *(undefined4 *)local_ca0 = 0x6f79616c;
      builtin_strncpy((char *)((long)local_ca0 + 4),"ut(l",4);
      *(undefined4 *)(local_ca0 + 1) = 0x6c61636f;
      builtin_strncpy((char *)((long)local_ca0 + 0xc),"_siz",4);
      builtin_strncpy((char *)((long)local_ca0 + 0x1f)," in;",4);
      local_c98 = (ulong)local_e50;
      *(char *)((long)local_ca0 + (long)local_e50) = '\0';
      local_e18._0_4_ = 2;
      local_e10._M_p = (pointer)&local_e00;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e10,local_ca0,(char *)((long)local_ca0 + (long)local_e50));
      local_df0 = 4;
      local_de8.m_data = 5;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (local_4f8,(SpecConstant *)local_dc0,(SpecConstant *)local_e18);
      local_660 = 0x10;
      local_658 = local_500;
      std::__cxx11::string::_M_construct<char*>
                (local_390,local_d30,local_d28._M_p + (long)local_d30);
      local_638 = local_508;
      std::__cxx11::string::_M_construct<char*>
                (local_398,local_1038,(char *)((long)local_1030 + (long)local_1038));
      local_618 = local_510;
      std::__cxx11::string::_M_construct<char*>
                (local_3a0,local_fd0._0_8_,(char *)(local_fd0._0_8_ + local_fd0.value.m_data));
      local_158.size = 4;
      local_158.offset = 0;
      local_158.value.m_data = 1;
      local_168.size = 4;
      local_168.offset = 4;
      local_168.value.m_data = 2;
      local_178.size = 4;
      local_178.offset = 8;
      local_178.value.m_data = 5;
      local_188.size = 4;
      local_188.offset = 0xc;
      local_188.value.m_data = 10;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (local_3a8,&local_158,&local_168,&local_178,&local_188);
      local_5e0 = 0;
      local_5d8 = &local_5c8;
      local_5c6 = 0x7a;
      local_5c8 = 0x7978;
      local_5d0 = 3;
      local_5c5 = 0;
      local_b90._0_8_ = local_b80;
      local_e88 = (undefined1  [8])0x23;
      local_b90._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_b90,(ulong)local_e88);
      local_b80[0] = (ulong)local_e88;
      *(undefined8 *)(local_b90._0_8_ + 0x10) = 0x3d2064695f785f65;
      *(undefined8 *)(local_b90._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_b90._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_b90._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_b90._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_b90._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_b90._0_8_ + 0x1f)," in;",4);
      local_b90.value.m_data = (deUint64)local_e88;
      *(char *)(local_b90._0_8_ + (long)local_e88) = '\0';
      local_e50._0_4_ = 1;
      local_e48._M_p = (pointer)&local_e38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e48,local_b90._0_8_,(char *)(local_b90._0_8_ + (long)local_e88));
      local_e28 = 4;
      local_e20.m_data = 3;
      local_bb0._0_8_ = local_ba0;
      local_ec0 = (undefined1  [8])0x23;
      local_bb0._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_bb0,(ulong)local_ec0);
      local_ba0[0] = (pointer *)local_ec0;
      *(undefined8 *)(local_bb0._0_8_ + 0x10) = 0x3d2064695f795f65;
      *(undefined8 *)(local_bb0._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_bb0._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_bb0._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_bb0._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_bb0._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_bb0._0_8_ + 0x1f)," in;",4);
      local_bb0.value.m_data = (deUint64)local_ec0;
      *(char *)(local_bb0._0_8_ + (long)local_ec0) = '\0';
      local_e88._0_4_ = 2;
      local_e80._M_p = (pointer)&local_e70;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e80,local_bb0._0_8_,(char *)(local_bb0._0_8_ + (long)local_ec0));
      local_e60 = 4;
      local_e58.m_data = 5;
      local_4b8._0_8_ = local_4a8;
      local_380.size = 0x23;
      local_380.offset = 0;
      local_4b8._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_4b8,(ulong)&local_380);
      local_4a8[0]._0_4_ = local_380.size;
      local_4a8[0]._4_4_ = local_380.offset;
      *(undefined8 *)(local_4b8._0_8_ + 0x10) = 0x3d2064695f7a5f65;
      *(undefined8 *)(local_4b8._0_8_ + 0x18) = 0x20297d44497b2420;
      *(undefined4 *)local_4b8._0_8_ = 0x6f79616c;
      builtin_strncpy((char *)(local_4b8._0_8_ + 4),"ut(l",4);
      *(undefined4 *)(local_4b8._0_8_ + 8) = 0x6c61636f;
      builtin_strncpy((char *)(local_4b8._0_8_ + 0xc),"_siz",4);
      builtin_strncpy((char *)(local_4b8._0_8_ + 0x1f)," in;",4);
      local_4b8.value.m_data._0_4_ = local_380.size;
      local_4b8.value.m_data._4_4_ = local_380.offset;
      *(char *)(local_4b8._0_8_ + local_380._0_8_) = '\0';
      local_ec0._0_4_ = 3;
      local_eb8._M_p = (pointer)&local_ea8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_eb8,local_4b8._0_8_,(char *)(local_4b8._0_8_ + local_380._0_8_));
      local_e98 = 4;
      local_e90.m_data = 7;
      makeVector<vkt::pipeline::(anonymous_namespace)::SpecConstant>
                (&local_5b8,(SpecConstant *)local_e50,(SpecConstant *)local_e88,
                 (SpecConstant *)local_ec0);
      local_5a0 = 0x10;
      local_598[0] = local_588;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_598,local_d30,local_d28._M_p + (long)local_d30);
      local_578[0] = local_568;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_578,local_1038,(char *)((long)local_1030 + (long)local_1038));
      local_558[0] = local_548;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_558,local_fd0._0_8_,
                 (char *)(local_fd0._0_8_ + local_fd0.value.m_data));
      local_380.size = 4;
      local_380.offset = 0;
      local_380.value.m_data = 3;
      local_198.size = 4;
      local_198.offset = 4;
      local_198.value.m_data = 5;
      local_1a8.size = 4;
      local_1a8.offset = 8;
      local_1a8.value.m_data = 7;
      local_1b8.size = 4;
      local_1b8.offset = 0xc;
      local_1b8.value.m_data = 0x69;
      makeVector<vkt::pipeline::(anonymous_namespace)::OffsetValue>
                (&local_538,&local_380,&local_198,&local_1a8,&local_1b8);
      local_520 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_eb8._M_p != &local_ea8) {
        operator_delete(local_eb8._M_p,local_ea8._M_allocated_capacity + 1);
      }
      if ((deUint64 *)local_4b8._0_8_ != local_4a8) {
        operator_delete((void *)local_4b8._0_8_,local_4a8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e80._M_p != &local_e70) {
        operator_delete(local_e80._M_p,local_e70._M_allocated_capacity + 1);
      }
      if ((pointer **)local_bb0._0_8_ != local_ba0) {
        operator_delete((void *)local_bb0._0_8_,(long)local_ba0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e48._M_p != &local_e38) {
        operator_delete(local_e48._M_p,local_e38._M_allocated_capacity + 1);
      }
      if ((ulong *)local_b90._0_8_ != local_b80) {
        operator_delete((void *)local_b90._0_8_,local_b80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e10._M_p != &local_e00) {
        operator_delete(local_e10._M_p,local_e00._M_allocated_capacity + 1);
      }
      if (local_ca0 != local_c90) {
        operator_delete(local_ca0,local_c90[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_db8._M_p != &local_da8) {
        operator_delete(local_db8._M_p,local_da8._M_allocated_capacity + 1);
      }
      if (local_de0 != local_dd0) {
        operator_delete(local_de0,local_dd0[0] + 1);
      }
      if (local_d60._M_p != local_d58 + 8) {
        operator_delete(local_d60._M_p,local_d58._8_8_ + 1);
      }
      if (local_c80 != local_c70) {
        operator_delete(local_c80,local_c70[0] + 1);
      }
      if (local_ef0._M_p != local_ee8 + 8) {
        operator_delete(local_ef0._M_p,local_ee8._8_8_ + 1);
      }
      if ((pointer *)local_fb0._0_8_ != local_fa0) {
        operator_delete((void *)local_fb0._0_8_,(ulong)(local_fa0[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f88._M_p != &local_f78) {
        operator_delete(local_f88._M_p,local_f78._M_allocated_capacity + 1);
      }
      if ((pointer *)local_cf8._0_8_ != local_ce8) {
        operator_delete((void *)local_cf8._0_8_,(ulong)(local_ce8[0] + 1));
      }
      if (local_1008._M_p != local_1000 + 8) {
        operator_delete(local_1008._M_p,local_1000._8_8_ + 1);
      }
      if ((pointer *)local_f58._0_8_ != local_f48) {
        operator_delete((void *)local_f58._0_8_,(ulong)(local_f48[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1068._M_p != &local_1058) {
        operator_delete(local_1068._M_p,local_1058._M_allocated_capacity + 1);
      }
      if ((pointer *)local_f38._0_8_ != local_f28) {
        operator_delete((void *)local_f38._0_8_,(ulong)(local_f28[0] + 1));
      }
      if (local_b38._M_p != local_b28) {
        operator_delete(local_b38._M_p,local_b28._0_8_ + 1);
      }
      if ((pointer *)local_f18._0_8_ != local_f08) {
        operator_delete((void *)local_f18._0_8_,(ulong)(local_f08[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_p != &local_338) {
        operator_delete(local_348._M_p,local_338._M_allocated_capacity + 1);
      }
      if ((pointer *)local_d88._0_8_ != local_d78) {
        operator_delete((void *)local_d88._0_8_,(ulong)(local_d78[0] + 1));
      }
      lVar16 = 0;
      do {
        pSVar7 = (SpecConstantTest *)operator_new(0x138);
        anon_unknown_0::SpecConstantTest::SpecConstantTest
                  (pSVar7,local_1080,VK_SHADER_STAGE_COMPUTE_BIT,
                   (CaseDefinition *)(local_a58 + lVar16));
        tcu::TestNode::addChild(pTVar6,(TestNode *)pSVar7);
        lVar16 = lVar16 + 0xc0;
      } while (lVar16 != 0x540);
      lVar16 = 0x480;
      do {
        anon_unknown_0::CaseDefinition::~CaseDefinition((CaseDefinition *)(local_a58 + lVar16));
        lVar16 = lVar16 + -0xc0;
      } while (lVar16 != -0xc0);
      if ((pointer *)local_fd0._0_8_ != local_fc0) {
        operator_delete((void *)local_fd0._0_8_,(ulong)(local_fc0[0] + 1));
      }
      if (local_1038 != local_1028) {
        operator_delete(local_1038,(long)local_1028[0] + 1);
      }
      if (local_d30 != (undefined1  [8])&local_d20) {
        operator_delete((void *)local_d30,(ulong)(local_d20 + 1));
      }
      tcu::TestNode::addChild(local_c60,pTVar6);
    }
    tcu::TestNode::addChild(*local_3f0,local_c60);
    lVar16 = local_1d0 + 1;
    if (lVar16 == 6) {
      return (TestCaseGroup *)local_518;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createSpecConstantTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> allTests (new tcu::TestCaseGroup(testCtx, "spec_constant", "Specialization constants tests"));
	de::MovePtr<tcu::TestCaseGroup> graphicsGroup (new tcu::TestCaseGroup(testCtx, "graphics", ""));

	struct StageDef
	{
		tcu::TestCaseGroup*		parentGroup;
		const char*				name;
		VkShaderStageFlagBits	stage;
	};

	const StageDef stages[] =
	{
		{ graphicsGroup.get(),	"vertex",		VK_SHADER_STAGE_VERTEX_BIT					},
		{ graphicsGroup.get(),	"fragment",		VK_SHADER_STAGE_FRAGMENT_BIT				},
		{ graphicsGroup.get(),	"tess_control",	VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT	},
		{ graphicsGroup.get(),	"tess_eval",	VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT	},
		{ graphicsGroup.get(),	"geometry",		VK_SHADER_STAGE_GEOMETRY_BIT				},
		{ allTests.get(),		"compute",		VK_SHADER_STAGE_COMPUTE_BIT					},
	};

	allTests->addChild(graphicsGroup.release());

	for (int stageNdx = 0; stageNdx < DE_LENGTH_OF_ARRAY(stages); ++stageNdx)
	{
		const StageDef& stage = stages[stageNdx];
		de::MovePtr<tcu::TestCaseGroup> stageGroup (new tcu::TestCaseGroup(testCtx, stage.name, ""));

		stageGroup->addChild(createDefaultValueTests       (testCtx, stage.stage));
		stageGroup->addChild(createBasicSpecializationTests(testCtx, stage.stage));
		stageGroup->addChild(createBuiltInOverrideTests    (testCtx, stage.stage));
		stageGroup->addChild(createExpressionTests         (testCtx, stage.stage));
		stageGroup->addChild(createCompositeTests          (testCtx, stage.stage));

		if (stage.stage == VK_SHADER_STAGE_COMPUTE_BIT)
			stageGroup->addChild(createWorkGroupSizeTests(testCtx));

		stage.parentGroup->addChild(stageGroup.release());
	}

	return allTests.release();
}